

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar62;
  int iVar63;
  long lVar64;
  uint uVar65;
  ulong uVar67;
  ulong uVar68;
  bool bVar69;
  LinearSpace3fa *pLVar70;
  bool bVar71;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar103;
  vint4 bi_2;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar82;
  float fVar104;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  vint4 ai;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar121;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar122;
  float fVar139;
  float fVar140;
  vint4 bi;
  undefined1 auVar123 [16];
  float fVar141;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar142;
  float fVar143;
  float fVar158;
  float fVar161;
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar163;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar159;
  float fVar162;
  float fVar164;
  undefined1 auVar155 [32];
  float fVar160;
  float fVar165;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar166;
  float fVar185;
  float fVar186;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar187;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar197;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar199;
  undefined1 auVar196 [32];
  vfloat4 b0;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  vint4 ai_1;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar240;
  float fVar241;
  undefined1 auVar239 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  float fVar248;
  float fVar256;
  float fVar257;
  __m128 a;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar258;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar267;
  float fVar268;
  vfloat4 a0;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  undefined1 auVar266 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar281 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar285;
  float fVar286;
  undefined1 auVar284 [32];
  float fVar287;
  float fVar292;
  float fVar293;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5e9;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float fStack_540;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_468;
  LinearSpace3fa *local_460;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 auStack_3c8 [16];
  uint auStack_3b8 [4];
  RTCFilterFunctionNArguments local_3a8;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar66;
  undefined1 auVar138 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  fVar122 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar83._0_4_ = fVar122 * auVar92._0_4_;
  auVar83._4_4_ = fVar122 * auVar92._4_4_;
  auVar83._8_4_ = fVar122 * auVar92._8_4_;
  auVar83._12_4_ = fVar122 * auVar92._12_4_;
  auVar167._0_4_ = fVar122 * auVar13._0_4_;
  auVar167._4_4_ = fVar122 * auVar13._4_4_;
  auVar167._8_4_ = fVar122 * auVar13._8_4_;
  auVar167._12_4_ = fVar122 * auVar13._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar68 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar67 = (ulong)(uint)((int)(uVar68 * 9) * 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + uVar68 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar67 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar74 = vshufps_avx(auVar167,auVar167,0);
  auVar110 = vshufps_avx(auVar167,auVar167,0x55);
  auVar105 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar122 = auVar105._0_4_;
  fVar142 = auVar105._4_4_;
  fVar166 = auVar105._8_4_;
  fVar139 = auVar105._12_4_;
  fVar186 = auVar110._0_4_;
  fVar141 = auVar110._4_4_;
  fVar163 = auVar110._8_4_;
  fVar187 = auVar110._12_4_;
  fVar158 = auVar74._0_4_;
  fVar185 = auVar74._4_4_;
  fVar140 = auVar74._8_4_;
  fVar161 = auVar74._12_4_;
  auVar263._0_4_ = fVar158 * auVar92._0_4_ + fVar186 * auVar13._0_4_ + fVar122 * auVar183._0_4_;
  auVar263._4_4_ = fVar185 * auVar92._4_4_ + fVar141 * auVar13._4_4_ + fVar142 * auVar183._4_4_;
  auVar263._8_4_ = fVar140 * auVar92._8_4_ + fVar163 * auVar13._8_4_ + fVar166 * auVar183._8_4_;
  auVar263._12_4_ = fVar161 * auVar92._12_4_ + fVar187 * auVar13._12_4_ + fVar139 * auVar183._12_4_;
  auVar277._0_4_ = fVar158 * auVar14._0_4_ + fVar186 * auVar15._0_4_ + auVar16._0_4_ * fVar122;
  auVar277._4_4_ = fVar185 * auVar14._4_4_ + fVar141 * auVar15._4_4_ + auVar16._4_4_ * fVar142;
  auVar277._8_4_ = fVar140 * auVar14._8_4_ + fVar163 * auVar15._8_4_ + auVar16._8_4_ * fVar166;
  auVar277._12_4_ = fVar161 * auVar14._12_4_ + fVar187 * auVar15._12_4_ + auVar16._12_4_ * fVar139;
  auVar168._0_4_ = fVar158 * auVar72._0_4_ + fVar186 * auVar91._0_4_ + auVar84._0_4_ * fVar122;
  auVar168._4_4_ = fVar185 * auVar72._4_4_ + fVar141 * auVar91._4_4_ + auVar84._4_4_ * fVar142;
  auVar168._8_4_ = fVar140 * auVar72._8_4_ + fVar163 * auVar91._8_4_ + auVar84._8_4_ * fVar166;
  auVar168._12_4_ = fVar161 * auVar72._12_4_ + fVar187 * auVar91._12_4_ + auVar84._12_4_ * fVar139;
  auVar74 = vshufps_avx(auVar83,auVar83,0);
  auVar110 = vshufps_avx(auVar83,auVar83,0x55);
  auVar105 = vshufps_avx(auVar83,auVar83,0xaa);
  fVar122 = auVar105._0_4_;
  fVar142 = auVar105._4_4_;
  fVar166 = auVar105._8_4_;
  fVar139 = auVar105._12_4_;
  fVar186 = auVar110._0_4_;
  fVar141 = auVar110._4_4_;
  fVar163 = auVar110._8_4_;
  fVar187 = auVar110._12_4_;
  fVar158 = auVar74._0_4_;
  fVar185 = auVar74._4_4_;
  fVar140 = auVar74._8_4_;
  fVar161 = auVar74._12_4_;
  auVar188._0_4_ = fVar158 * auVar92._0_4_ + fVar186 * auVar13._0_4_ + fVar122 * auVar183._0_4_;
  auVar188._4_4_ = fVar185 * auVar92._4_4_ + fVar141 * auVar13._4_4_ + fVar142 * auVar183._4_4_;
  auVar188._8_4_ = fVar140 * auVar92._8_4_ + fVar163 * auVar13._8_4_ + fVar166 * auVar183._8_4_;
  auVar188._12_4_ = fVar161 * auVar92._12_4_ + fVar187 * auVar13._12_4_ + fVar139 * auVar183._12_4_;
  auVar74._0_4_ = fVar158 * auVar14._0_4_ + auVar16._0_4_ * fVar122 + fVar186 * auVar15._0_4_;
  auVar74._4_4_ = fVar185 * auVar14._4_4_ + auVar16._4_4_ * fVar142 + fVar141 * auVar15._4_4_;
  auVar74._8_4_ = fVar140 * auVar14._8_4_ + auVar16._8_4_ * fVar166 + fVar163 * auVar15._8_4_;
  auVar74._12_4_ = fVar161 * auVar14._12_4_ + auVar16._12_4_ * fVar139 + fVar187 * auVar15._12_4_;
  auVar294._8_4_ = 0x7fffffff;
  auVar294._0_8_ = 0x7fffffff7fffffff;
  auVar294._12_4_ = 0x7fffffff;
  auVar300 = ZEXT1664(auVar294);
  auVar92 = vandps_avx(auVar263,auVar294);
  auVar144._8_4_ = 0x219392ef;
  auVar144._0_8_ = 0x219392ef219392ef;
  auVar144._12_4_ = 0x219392ef;
  auVar92 = vcmpps_avx(auVar92,auVar144,1);
  auVar13 = vblendvps_avx(auVar263,auVar144,auVar92);
  auVar92 = vandps_avx(auVar277,auVar294);
  auVar92 = vcmpps_avx(auVar92,auVar144,1);
  auVar183 = vblendvps_avx(auVar277,auVar144,auVar92);
  auVar92 = vandps_avx(auVar294,auVar168);
  auVar92 = vcmpps_avx(auVar92,auVar144,1);
  auVar92 = vblendvps_avx(auVar168,auVar144,auVar92);
  auVar110._0_4_ = fVar158 * auVar72._0_4_ + fVar186 * auVar91._0_4_ + auVar84._0_4_ * fVar122;
  auVar110._4_4_ = fVar185 * auVar72._4_4_ + fVar141 * auVar91._4_4_ + auVar84._4_4_ * fVar142;
  auVar110._8_4_ = fVar140 * auVar72._8_4_ + fVar163 * auVar91._8_4_ + auVar84._8_4_ * fVar166;
  auVar110._12_4_ = fVar161 * auVar72._12_4_ + fVar187 * auVar91._12_4_ + auVar84._12_4_ * fVar139;
  auVar14 = vrcpps_avx(auVar13);
  fVar122 = auVar14._0_4_;
  auVar123._0_4_ = fVar122 * auVar13._0_4_;
  fVar139 = auVar14._4_4_;
  auVar123._4_4_ = fVar139 * auVar13._4_4_;
  fVar140 = auVar14._8_4_;
  auVar123._8_4_ = fVar140 * auVar13._8_4_;
  fVar141 = auVar14._12_4_;
  auVar123._12_4_ = fVar141 * auVar13._12_4_;
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = &DAT_3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar209,auVar123);
  fVar122 = fVar122 + fVar122 * auVar13._0_4_;
  fVar139 = fVar139 + fVar139 * auVar13._4_4_;
  fVar140 = fVar140 + fVar140 * auVar13._8_4_;
  fVar141 = fVar141 + fVar141 * auVar13._12_4_;
  auVar13 = vrcpps_avx(auVar183);
  fVar142 = auVar13._0_4_;
  auVar145._0_4_ = fVar142 * auVar183._0_4_;
  fVar158 = auVar13._4_4_;
  auVar145._4_4_ = fVar158 * auVar183._4_4_;
  fVar161 = auVar13._8_4_;
  auVar145._8_4_ = fVar161 * auVar183._8_4_;
  fVar163 = auVar13._12_4_;
  auVar145._12_4_ = fVar163 * auVar183._12_4_;
  auVar13 = vsubps_avx(auVar209,auVar145);
  fVar142 = fVar142 + fVar142 * auVar13._0_4_;
  fVar158 = fVar158 + fVar158 * auVar13._4_4_;
  fVar161 = fVar161 + fVar161 * auVar13._8_4_;
  fVar163 = fVar163 + fVar163 * auVar13._12_4_;
  auVar13 = vrcpps_avx(auVar92);
  fVar166 = auVar13._0_4_;
  auVar169._0_4_ = fVar166 * auVar92._0_4_;
  fVar185 = auVar13._4_4_;
  auVar169._4_4_ = fVar185 * auVar92._4_4_;
  fVar186 = auVar13._8_4_;
  auVar169._8_4_ = fVar186 * auVar92._8_4_;
  fVar187 = auVar13._12_4_;
  auVar169._12_4_ = fVar187 * auVar92._12_4_;
  auVar13 = vsubps_avx(auVar209,auVar169);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  fVar166 = fVar166 + fVar166 * auVar13._0_4_;
  fVar185 = fVar185 + fVar185 * auVar13._4_4_;
  fVar186 = fVar186 + fVar186 * auVar13._8_4_;
  fVar187 = fVar187 + fVar187 * auVar13._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar188);
  auVar105._0_4_ = fVar122 * auVar92._0_4_;
  auVar105._4_4_ = fVar139 * auVar92._4_4_;
  auVar105._8_4_ = fVar140 * auVar92._8_4_;
  auVar105._12_4_ = fVar141 * auVar92._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar92 = vpmovsxwd_avx(auVar13);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar188);
  auVar124._0_4_ = fVar122 * auVar92._0_4_;
  auVar124._4_4_ = fVar139 * auVar92._4_4_;
  auVar124._8_4_ = fVar140 * auVar92._8_4_;
  auVar124._12_4_ = fVar141 * auVar92._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar183);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar68 * -2 + 6);
  auVar92 = vpmovsxwd_avx(auVar14);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar74);
  auVar210._0_4_ = auVar92._0_4_ * fVar142;
  auVar210._4_4_ = auVar92._4_4_ * fVar158;
  auVar210._8_4_ = auVar92._8_4_ * fVar161;
  auVar210._12_4_ = auVar92._12_4_ * fVar163;
  auVar92 = vcvtdq2ps_avx(auVar13);
  auVar92 = vsubps_avx(auVar92,auVar74);
  auVar72._0_4_ = fVar142 * auVar92._0_4_;
  auVar72._4_4_ = fVar158 * auVar92._4_4_;
  auVar72._8_4_ = fVar161 * auVar92._8_4_;
  auVar72._12_4_ = fVar163 * auVar92._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar67 + uVar68 + 6);
  auVar92 = vpmovsxwd_avx(auVar15);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar110);
  auVar146._0_4_ = auVar92._0_4_ * fVar166;
  auVar146._4_4_ = auVar92._4_4_ * fVar185;
  auVar146._8_4_ = auVar92._8_4_ * fVar186;
  auVar146._12_4_ = auVar92._12_4_ * fVar187;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 6);
  auVar92 = vpmovsxwd_avx(auVar16);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar110);
  auVar84._0_4_ = auVar92._0_4_ * fVar166;
  auVar84._4_4_ = auVar92._4_4_ * fVar185;
  auVar84._8_4_ = auVar92._8_4_ * fVar186;
  auVar84._12_4_ = auVar92._12_4_ * fVar187;
  auVar92 = vpminsd_avx(auVar105,auVar124);
  auVar13 = vpminsd_avx(auVar210,auVar72);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  auVar13 = vpminsd_avx(auVar146,auVar84);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar224._4_4_ = uVar3;
  auVar224._0_4_ = uVar3;
  auVar224._8_4_ = uVar3;
  auVar224._12_4_ = uVar3;
  auVar13 = vmaxps_avx(auVar13,auVar224);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  local_318._0_4_ = auVar92._0_4_ * 0.99999964;
  local_318._4_4_ = auVar92._4_4_ * 0.99999964;
  local_318._8_4_ = auVar92._8_4_ * 0.99999964;
  local_318._12_4_ = auVar92._12_4_ * 0.99999964;
  auVar92 = vpmaxsd_avx(auVar105,auVar124);
  auVar13 = vpmaxsd_avx(auVar210,auVar72);
  auVar92 = vminps_avx(auVar92,auVar13);
  auVar13 = vpmaxsd_avx(auVar146,auVar84);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar3;
  auVar106._0_4_ = uVar3;
  auVar106._8_4_ = uVar3;
  auVar106._12_4_ = uVar3;
  auVar13 = vminps_avx(auVar13,auVar106);
  auVar92 = vminps_avx(auVar92,auVar13);
  auVar91._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar92 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar13 = vpcmpgtd_avx(auVar92,_DAT_01ff0cf0);
  auVar92 = vcmpps_avx(local_318,auVar91,2);
  auVar92 = vandps_avx(auVar92,auVar13);
  uVar61 = vmovmskps_avx(auVar92);
  local_5e9 = uVar61 != 0;
  if (uVar61 == 0) {
    return local_5e9;
  }
  uVar61 = uVar61 & 0xff;
  auVar77._16_16_ = mm_lookupmask_ps._240_16_;
  auVar77._0_16_ = mm_lookupmask_ps._240_16_;
  pLVar70 = pre->ray_space + k;
  local_228 = vblendps_avx(auVar77,ZEXT832(0) << 0x20,0x80);
  local_468 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_460 = pLVar70;
LAB_00f10917:
  uVar67 = (ulong)uVar61;
  lVar64 = 0;
  if (uVar67 != 0) {
    for (; (uVar61 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
    }
  }
  uVar61 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar61].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar64 * 4 + 6));
  p_Var8 = pGVar7[1].intersectionFilterN;
  pvVar9 = pGVar7[2].userPtr;
  _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  puVar1 = (undefined8 *)(_Var10 + uVar68 * (long)pvVar9);
  uVar4 = *puVar1;
  uVar56 = puVar1[1];
  pfVar2 = (float *)(_Var10 + (uVar68 + 1) * (long)pvVar9);
  fVar122 = *pfVar2;
  fVar142 = pfVar2[1];
  fVar166 = pfVar2[2];
  fVar139 = pfVar2[3];
  pfVar2 = (float *)(_Var10 + (uVar68 + 2) * (long)pvVar9);
  fVar158 = *pfVar2;
  fVar185 = pfVar2[1];
  fVar140 = pfVar2[2];
  fVar161 = pfVar2[3];
  pfVar2 = (float *)(_Var10 + (long)pvVar9 * (uVar68 + 3));
  fVar186 = *pfVar2;
  fVar141 = pfVar2[1];
  fVar163 = pfVar2[2];
  fVar187 = pfVar2[3];
  uVar67 = uVar67 - 1 & uVar67;
  lVar11 = *(long *)&pGVar7[1].time_range.upper;
  pfVar2 = (float *)(lVar11 + (long)p_Var8 * uVar68);
  fVar81 = *pfVar2;
  fVar82 = pfVar2[1];
  fVar103 = pfVar2[2];
  fVar104 = pfVar2[3];
  auVar92 = *(undefined1 (*) [16])(lVar11 + (long)p_Var8 * (uVar68 + 1));
  pfVar2 = (float *)(lVar11 + (long)p_Var8 * (uVar68 + 2));
  fVar121 = *pfVar2;
  fVar240 = pfVar2[1];
  fVar241 = pfVar2[2];
  fVar248 = pfVar2[3];
  lVar12 = 0;
  if (uVar67 != 0) {
    for (; (uVar67 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  pfVar2 = (float *)(lVar11 + (long)p_Var8 * (uVar68 + 3));
  fVar143 = *pfVar2;
  fVar159 = pfVar2[1];
  fVar162 = pfVar2[2];
  fVar164 = pfVar2[3];
  if (((uVar67 != 0) && (uVar68 = uVar67 - 1 & uVar67, uVar68 != 0)) && (lVar11 = 0, uVar68 != 0)) {
    for (; (uVar68 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar256 = auVar92._0_4_;
  fVar160 = auVar92._4_4_;
  fVar257 = auVar92._8_4_;
  fVar165 = auVar92._12_4_;
  local_558._0_4_ = fVar81 * 0.16666667 + fVar256 * 0.6666667 + fVar121 * 0.16666667 + fVar143 * 0.0
  ;
  local_558._4_4_ = fVar82 * 0.16666667 + fVar160 * 0.6666667 + fVar240 * 0.16666667 + fVar159 * 0.0
  ;
  fStack_550 = fVar103 * 0.16666667 + fVar257 * 0.6666667 + fVar241 * 0.16666667 + fVar162 * 0.0;
  fStack_54c = fVar104 * 0.16666667 + fVar165 * 0.6666667 + fVar248 * 0.16666667 + fVar164 * 0.0;
  auVar107._0_4_ = fVar121 * 0.5 + fVar143 * 0.0;
  auVar107._4_4_ = fVar240 * 0.5 + fVar159 * 0.0;
  auVar107._8_4_ = fVar241 * 0.5 + fVar162 * 0.0;
  auVar107._12_4_ = fVar248 * 0.5 + fVar164 * 0.0;
  auVar249._0_4_ = fVar256 * 0.0;
  auVar249._4_4_ = fVar160 * 0.0;
  auVar249._8_4_ = fVar257 * 0.0;
  auVar249._12_4_ = fVar165 * 0.0;
  auVar92 = vsubps_avx(auVar107,auVar249);
  auVar250._0_4_ = fVar81 * 0.5;
  auVar250._4_4_ = fVar82 * 0.5;
  auVar250._8_4_ = fVar103 * 0.5;
  auVar250._12_4_ = fVar104 * 0.5;
  auVar110 = vsubps_avx(auVar92,auVar250);
  local_5a8._0_4_ = (undefined4)uVar4;
  local_5a8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  fStack_5a0 = (float)uVar56;
  fStack_59c = (float)((ulong)uVar56 >> 0x20);
  local_538._0_4_ =
       (float)local_5a8._0_4_ * 0.16666667 +
       fVar122 * 0.6666667 + fVar158 * 0.16666667 + fVar186 * 0.0;
  local_538._4_4_ =
       (float)local_5a8._4_4_ * 0.16666667 +
       fVar142 * 0.6666667 + fVar185 * 0.16666667 + fVar141 * 0.0;
  fStack_530 = fStack_5a0 * 0.16666667 + fVar166 * 0.6666667 + fVar140 * 0.16666667 + fVar163 * 0.0;
  fStack_52c = fStack_59c * 0.16666667 + fVar139 * 0.6666667 + fVar161 * 0.16666667 + fVar187 * 0.0;
  auVar264._0_4_ = fVar158 * 0.5 + fVar186 * 0.0;
  auVar264._4_4_ = fVar185 * 0.5 + fVar141 * 0.0;
  auVar264._8_4_ = fVar140 * 0.5 + fVar163 * 0.0;
  auVar264._12_4_ = fVar161 * 0.5 + fVar187 * 0.0;
  auVar278._0_4_ = fVar122 * 0.0;
  auVar278._4_4_ = fVar142 * 0.0;
  auVar278._8_4_ = fVar166 * 0.0;
  auVar278._12_4_ = fVar139 * 0.0;
  auVar92 = vsubps_avx(auVar264,auVar278);
  auVar279._0_4_ = (float)local_5a8._0_4_ * 0.5;
  auVar279._4_4_ = (float)local_5a8._4_4_ * 0.5;
  auVar279._8_4_ = fStack_5a0 * 0.5;
  auVar279._12_4_ = fStack_59c * 0.5;
  auVar15 = vsubps_avx(auVar92,auVar279);
  auVar288._0_4_ = fVar81 * 0.0;
  auVar288._4_4_ = fVar82 * 0.0;
  auVar288._8_4_ = fVar103 * 0.0;
  auVar288._12_4_ = fVar104 * 0.0;
  local_578._0_4_ =
       auVar288._0_4_ + fVar256 * 0.16666667 + fVar121 * 0.6666667 + fVar143 * 0.16666667;
  local_578._4_4_ =
       auVar288._4_4_ + fVar160 * 0.16666667 + fVar240 * 0.6666667 + fVar159 * 0.16666667;
  fStack_570 = auVar288._8_4_ + fVar257 * 0.16666667 + fVar241 * 0.6666667 + fVar162 * 0.16666667;
  fStack_56c = auVar288._12_4_ + fVar165 * 0.16666667 + fVar248 * 0.6666667 + fVar164 * 0.16666667;
  auVar225._0_4_ = fVar121 * 0.0 + fVar143 * 0.5;
  auVar225._4_4_ = fVar240 * 0.0 + fVar159 * 0.5;
  auVar225._8_4_ = fVar241 * 0.0 + fVar162 * 0.5;
  auVar225._12_4_ = fVar248 * 0.0 + fVar164 * 0.5;
  auVar147._0_4_ = fVar256 * 0.5;
  auVar147._4_4_ = fVar160 * 0.5;
  auVar147._8_4_ = fVar257 * 0.5;
  auVar147._12_4_ = fVar165 * 0.5;
  auVar92 = vsubps_avx(auVar225,auVar147);
  auVar105 = vsubps_avx(auVar92,auVar288);
  auVar189._0_4_ = (float)local_5a8._0_4_ * 0.0;
  auVar189._4_4_ = (float)local_5a8._4_4_ * 0.0;
  auVar189._8_4_ = fStack_5a0 * 0.0;
  auVar189._12_4_ = fStack_59c * 0.0;
  auVar226._0_4_ =
       fVar122 * 0.16666667 + fVar158 * 0.6666667 + fVar186 * 0.16666667 + auVar189._0_4_;
  auVar226._4_4_ =
       fVar142 * 0.16666667 + fVar185 * 0.6666667 + fVar141 * 0.16666667 + auVar189._4_4_;
  auVar226._8_4_ =
       fVar166 * 0.16666667 + fVar140 * 0.6666667 + fVar163 * 0.16666667 + auVar189._8_4_;
  auVar226._12_4_ =
       fVar139 * 0.16666667 + fVar161 * 0.6666667 + fVar187 * 0.16666667 + auVar189._12_4_;
  auVar200._0_4_ = fVar186 * 0.5 + fVar158 * 0.0;
  auVar200._4_4_ = fVar141 * 0.5 + fVar185 * 0.0;
  auVar200._8_4_ = fVar163 * 0.5 + fVar140 * 0.0;
  auVar200._12_4_ = fVar187 * 0.5 + fVar161 * 0.0;
  auVar170._0_4_ = fVar122 * 0.5;
  auVar170._4_4_ = fVar142 * 0.5;
  auVar170._8_4_ = fVar166 * 0.5;
  auVar170._12_4_ = fVar139 * 0.5;
  auVar92 = vsubps_avx(auVar200,auVar170);
  auVar72 = vsubps_avx(auVar92,auVar189);
  auVar92 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar13 = vshufps_avx(_local_538,_local_538,0xc9);
  fVar121 = auVar110._0_4_;
  auVar201._0_4_ = fVar121 * auVar13._0_4_;
  fVar240 = auVar110._4_4_;
  auVar201._4_4_ = fVar240 * auVar13._4_4_;
  fVar241 = auVar110._8_4_;
  auVar201._8_4_ = fVar241 * auVar13._8_4_;
  fVar248 = auVar110._12_4_;
  auVar201._12_4_ = fVar248 * auVar13._12_4_;
  auVar211._0_4_ = auVar92._0_4_ * (float)local_538._0_4_;
  auVar211._4_4_ = auVar92._4_4_ * (float)local_538._4_4_;
  auVar211._8_4_ = auVar92._8_4_ * fStack_530;
  auVar211._12_4_ = auVar92._12_4_ * fStack_52c;
  auVar13 = vsubps_avx(auVar211,auVar201);
  auVar183 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar202._0_4_ = fVar121 * auVar13._0_4_;
  auVar202._4_4_ = fVar240 * auVar13._4_4_;
  auVar202._8_4_ = fVar241 * auVar13._8_4_;
  auVar202._12_4_ = fVar248 * auVar13._12_4_;
  auVar171._0_4_ = auVar15._0_4_ * auVar92._0_4_;
  auVar171._4_4_ = auVar15._4_4_ * auVar92._4_4_;
  auVar171._8_4_ = auVar15._8_4_ * auVar92._8_4_;
  auVar171._12_4_ = auVar15._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar171,auVar202);
  auVar15 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar92 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar13 = vshufps_avx(auVar226,auVar226,0xc9);
  fVar143 = auVar105._0_4_;
  auVar172._0_4_ = fVar143 * auVar13._0_4_;
  fVar159 = auVar105._4_4_;
  auVar172._4_4_ = fVar159 * auVar13._4_4_;
  fVar162 = auVar105._8_4_;
  auVar172._8_4_ = fVar162 * auVar13._8_4_;
  fVar164 = auVar105._12_4_;
  auVar172._12_4_ = fVar164 * auVar13._12_4_;
  auVar227._0_4_ = auVar226._0_4_ * auVar92._0_4_;
  auVar227._4_4_ = auVar226._4_4_ * auVar92._4_4_;
  auVar227._8_4_ = auVar226._8_4_ * auVar92._8_4_;
  auVar227._12_4_ = auVar226._12_4_ * auVar92._12_4_;
  auVar13 = vsubps_avx(auVar227,auVar172);
  auVar16 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar228._0_4_ = auVar13._0_4_ * fVar143;
  auVar228._4_4_ = auVar13._4_4_ * fVar159;
  auVar228._8_4_ = auVar13._8_4_ * fVar162;
  auVar228._12_4_ = auVar13._12_4_ * fVar164;
  auVar190._0_4_ = auVar92._0_4_ * auVar72._0_4_;
  auVar190._4_4_ = auVar92._4_4_ * auVar72._4_4_;
  auVar190._8_4_ = auVar92._8_4_ * auVar72._8_4_;
  auVar190._12_4_ = auVar92._12_4_ * auVar72._12_4_;
  auVar13 = vsubps_avx(auVar190,auVar228);
  auVar92 = vdpps_avx(auVar183,auVar183,0x7f);
  auVar72 = vshufps_avx(auVar13,auVar13,0xc9);
  fVar158 = auVar92._0_4_;
  auVar84 = ZEXT416((uint)fVar158);
  auVar13 = vrsqrtss_avx(auVar84,auVar84);
  fVar122 = auVar13._0_4_;
  auVar13 = vdpps_avx(auVar183,auVar15,0x7f);
  auVar91 = ZEXT416((uint)(fVar122 * 1.5 - fVar158 * 0.5 * fVar122 * fVar122 * fVar122));
  auVar91 = vshufps_avx(auVar91,auVar91,0);
  fVar122 = auVar183._0_4_ * auVar91._0_4_;
  fVar142 = auVar183._4_4_ * auVar91._4_4_;
  fVar166 = auVar183._8_4_ * auVar91._8_4_;
  fVar139 = auVar183._12_4_ * auVar91._12_4_;
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar242._0_4_ = auVar15._0_4_ * auVar92._0_4_;
  auVar242._4_4_ = auVar15._4_4_ * auVar92._4_4_;
  auVar242._8_4_ = auVar15._8_4_ * auVar92._8_4_;
  auVar242._12_4_ = auVar15._12_4_ * auVar92._12_4_;
  auVar92 = vshufps_avx(auVar13,auVar13,0);
  auVar212._0_4_ = auVar183._0_4_ * auVar92._0_4_;
  auVar212._4_4_ = auVar183._4_4_ * auVar92._4_4_;
  auVar212._8_4_ = auVar183._8_4_ * auVar92._8_4_;
  auVar212._12_4_ = auVar183._12_4_ * auVar92._12_4_;
  auVar83 = vsubps_avx(auVar242,auVar212);
  auVar92 = vrcpss_avx(auVar84,auVar84);
  auVar13 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar92 = ZEXT416((uint)(auVar92._0_4_ * (2.0 - fVar158 * auVar92._0_4_)));
  auVar15 = vshufps_avx(auVar92,auVar92,0);
  auVar92 = vblendps_avx(auVar13,_DAT_01feba10,0xe);
  auVar183 = vrsqrtss_avx(auVar92,auVar92);
  fVar158 = auVar183._0_4_;
  auVar183 = ZEXT416((uint)(fVar158 * 1.5 - auVar13._0_4_ * 0.5 * fVar158 * fVar158 * fVar158));
  auVar84 = vshufps_avx(auVar183,auVar183,0);
  auVar183 = vdpps_avx(auVar16,auVar72,0x7f);
  fVar158 = auVar84._0_4_ * auVar16._0_4_;
  fVar185 = auVar84._4_4_ * auVar16._4_4_;
  fVar140 = auVar84._8_4_ * auVar16._8_4_;
  fVar161 = auVar84._12_4_ * auVar16._12_4_;
  auVar74 = vshufps_avx(auVar13,auVar13,0);
  auVar203._0_4_ = auVar74._0_4_ * auVar72._0_4_;
  auVar203._4_4_ = auVar74._4_4_ * auVar72._4_4_;
  auVar203._8_4_ = auVar74._8_4_ * auVar72._8_4_;
  auVar203._12_4_ = auVar74._12_4_ * auVar72._12_4_;
  auVar183 = vshufps_avx(auVar183,auVar183,0);
  auVar173._0_4_ = auVar183._0_4_ * auVar16._0_4_;
  auVar173._4_4_ = auVar183._4_4_ * auVar16._4_4_;
  auVar173._8_4_ = auVar183._8_4_ * auVar16._8_4_;
  auVar173._12_4_ = auVar183._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar203,auVar173);
  auVar92 = vrcpss_avx(auVar92,auVar92);
  auVar92 = ZEXT416((uint)((2.0 - auVar13._0_4_ * auVar92._0_4_) * auVar92._0_4_));
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar13 = vshufps_avx(_local_558,_local_558,0xff);
  auVar229._0_4_ = auVar13._0_4_ * fVar122;
  auVar229._4_4_ = auVar13._4_4_ * fVar142;
  auVar229._8_4_ = auVar13._8_4_ * fVar166;
  auVar229._12_4_ = auVar13._12_4_ * fVar139;
  _local_3f8 = vsubps_avx(_local_558,auVar229);
  auVar183 = vshufps_avx(auVar110,auVar110,0xff);
  auVar191._0_4_ =
       auVar183._0_4_ * fVar122 + auVar91._0_4_ * auVar83._0_4_ * auVar15._0_4_ * auVar13._0_4_;
  auVar191._4_4_ =
       auVar183._4_4_ * fVar142 + auVar91._4_4_ * auVar83._4_4_ * auVar15._4_4_ * auVar13._4_4_;
  auVar191._8_4_ =
       auVar183._8_4_ * fVar166 + auVar91._8_4_ * auVar83._8_4_ * auVar15._8_4_ * auVar13._8_4_;
  auVar191._12_4_ =
       auVar183._12_4_ * fVar139 + auVar91._12_4_ * auVar83._12_4_ * auVar15._12_4_ * auVar13._12_4_
  ;
  auVar15 = vsubps_avx(auVar110,auVar191);
  local_408._0_4_ = auVar229._0_4_ + (float)local_558._0_4_;
  local_408._4_4_ = auVar229._4_4_ + (float)local_558._4_4_;
  fStack_400 = auVar229._8_4_ + fStack_550;
  fStack_3fc = auVar229._12_4_ + fStack_54c;
  auVar13 = vshufps_avx(_local_578,_local_578,0xff);
  auVar108._0_4_ = fVar158 * auVar13._0_4_;
  auVar108._4_4_ = fVar185 * auVar13._4_4_;
  auVar108._8_4_ = fVar140 * auVar13._8_4_;
  auVar108._12_4_ = fVar161 * auVar13._12_4_;
  _local_418 = vsubps_avx(_local_578,auVar108);
  auVar183 = vshufps_avx(auVar105,auVar105,0xff);
  auVar85._0_4_ =
       fVar158 * auVar183._0_4_ + auVar13._0_4_ * auVar84._0_4_ * auVar16._0_4_ * auVar92._0_4_;
  auVar85._4_4_ =
       fVar185 * auVar183._4_4_ + auVar13._4_4_ * auVar84._4_4_ * auVar16._4_4_ * auVar92._4_4_;
  auVar85._8_4_ =
       fVar140 * auVar183._8_4_ + auVar13._8_4_ * auVar84._8_4_ * auVar16._8_4_ * auVar92._8_4_;
  auVar85._12_4_ =
       fVar161 * auVar183._12_4_ + auVar13._12_4_ * auVar84._12_4_ * auVar16._12_4_ * auVar92._12_4_
  ;
  auVar16 = vsubps_avx(auVar105,auVar85);
  local_578._0_4_ = (float)local_578._0_4_ + auVar108._0_4_;
  local_578._4_4_ = (float)local_578._4_4_ + auVar108._4_4_;
  fStack_570 = fStack_570 + auVar108._8_4_;
  fStack_56c = fStack_56c + auVar108._12_4_;
  local_428._0_4_ = local_3f8._0_4_ + auVar15._0_4_ * 0.33333334;
  local_428._4_4_ = local_3f8._4_4_ + auVar15._4_4_ * 0.33333334;
  fStack_420 = local_3f8._8_4_ + auVar15._8_4_ * 0.33333334;
  fStack_41c = local_3f8._12_4_ + auVar15._12_4_ * 0.33333334;
  local_288 = vsubps_avx(_local_3f8,auVar14);
  auVar13 = vmovsldup_avx(local_288);
  auVar92 = vmovshdup_avx(local_288);
  auVar183 = vshufps_avx(local_288,local_288,0xaa);
  fVar122 = (pLVar70->vx).field_0.m128[0];
  fVar142 = (pLVar70->vx).field_0.m128[1];
  fVar166 = (pLVar70->vx).field_0.m128[2];
  fVar139 = (pLVar70->vx).field_0.m128[3];
  fVar158 = (pLVar70->vy).field_0.m128[0];
  fVar185 = (pLVar70->vy).field_0.m128[1];
  fVar140 = (pLVar70->vy).field_0.m128[2];
  fVar161 = (pLVar70->vy).field_0.m128[3];
  fVar186 = (pLVar70->vz).field_0.m128[0];
  fVar141 = (pLVar70->vz).field_0.m128[1];
  fVar163 = (pLVar70->vz).field_0.m128[2];
  fVar187 = (pLVar70->vz).field_0.m128[3];
  fVar81 = fVar122 * auVar13._0_4_ + auVar183._0_4_ * fVar186 + fVar158 * auVar92._0_4_;
  fVar103 = fVar142 * auVar13._4_4_ + auVar183._4_4_ * fVar141 + fVar185 * auVar92._4_4_;
  local_558._4_4_ = fVar103;
  local_558._0_4_ = fVar81;
  fStack_550 = fVar166 * auVar13._8_4_ + auVar183._8_4_ * fVar163 + fVar140 * auVar92._8_4_;
  fStack_54c = fVar139 * auVar13._12_4_ + auVar183._12_4_ * fVar187 + fVar161 * auVar92._12_4_;
  local_298 = vsubps_avx(_local_428,auVar14);
  auVar183 = vshufps_avx(local_298,local_298,0xaa);
  auVar92 = vmovshdup_avx(local_298);
  auVar13 = vmovsldup_avx(local_298);
  fVar82 = auVar13._0_4_ * fVar122 + auVar92._0_4_ * fVar158 + fVar186 * auVar183._0_4_;
  fVar104 = auVar13._4_4_ * fVar142 + auVar92._4_4_ * fVar185 + fVar141 * auVar183._4_4_;
  local_5a8._4_4_ = fVar104;
  local_5a8._0_4_ = fVar82;
  fStack_5a0 = auVar13._8_4_ * fVar166 + auVar92._8_4_ * fVar140 + fVar163 * auVar183._8_4_;
  fStack_59c = auVar13._12_4_ * fVar139 + auVar92._12_4_ * fVar161 + fVar187 * auVar183._12_4_;
  auVar174._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar174._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar174._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar174._12_4_ = auVar16._12_4_ * 0.33333334;
  _local_438 = vsubps_avx(_local_418,auVar174);
  local_2a8 = vsubps_avx(_local_438,auVar14);
  auVar183 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar92 = vmovshdup_avx(local_2a8);
  auVar13 = vmovsldup_avx(local_2a8);
  auVar289._0_4_ = auVar13._0_4_ * fVar122 + auVar92._0_4_ * fVar158 + fVar186 * auVar183._0_4_;
  auVar289._4_4_ = auVar13._4_4_ * fVar142 + auVar92._4_4_ * fVar185 + fVar141 * auVar183._4_4_;
  auVar289._8_4_ = auVar13._8_4_ * fVar166 + auVar92._8_4_ * fVar140 + fVar163 * auVar183._8_4_;
  auVar289._12_4_ = auVar13._12_4_ * fVar139 + auVar92._12_4_ * fVar161 + fVar187 * auVar183._12_4_;
  local_2b8 = vsubps_avx(_local_418,auVar14);
  auVar183 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar92 = vmovshdup_avx(local_2b8);
  auVar13 = vmovsldup_avx(local_2b8);
  auVar280._0_8_ =
       CONCAT44(auVar13._4_4_ * fVar142 + auVar92._4_4_ * fVar185 + auVar183._4_4_ * fVar141,
                auVar13._0_4_ * fVar122 + auVar92._0_4_ * fVar158 + auVar183._0_4_ * fVar186);
  auVar280._8_4_ = auVar13._8_4_ * fVar166 + auVar92._8_4_ * fVar140 + auVar183._8_4_ * fVar163;
  auVar280._12_4_ = auVar13._12_4_ * fVar139 + auVar92._12_4_ * fVar161 + auVar183._12_4_ * fVar187;
  local_2c8 = vsubps_avx(_local_408,auVar14);
  auVar183 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar92 = vmovshdup_avx(local_2c8);
  auVar13 = vmovsldup_avx(local_2c8);
  auVar265._0_4_ = auVar13._0_4_ * fVar122 + auVar92._0_4_ * fVar158 + auVar183._0_4_ * fVar186;
  auVar265._4_4_ = auVar13._4_4_ * fVar142 + auVar92._4_4_ * fVar185 + auVar183._4_4_ * fVar141;
  auVar265._8_4_ = auVar13._8_4_ * fVar166 + auVar92._8_4_ * fVar140 + auVar183._8_4_ * fVar163;
  auVar265._12_4_ = auVar13._12_4_ * fVar139 + auVar92._12_4_ * fVar161 + auVar183._12_4_ * fVar187;
  local_448._0_4_ = (fVar121 + auVar191._0_4_) * 0.33333334 + (float)local_408._0_4_;
  local_448._4_4_ = (fVar240 + auVar191._4_4_) * 0.33333334 + (float)local_408._4_4_;
  fStack_440 = (fVar241 + auVar191._8_4_) * 0.33333334 + fStack_400;
  fStack_43c = (fVar248 + auVar191._12_4_) * 0.33333334 + fStack_3fc;
  local_2d8 = vsubps_avx(_local_448,auVar14);
  auVar183 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar92 = vmovshdup_avx(local_2d8);
  auVar13 = vmovsldup_avx(local_2d8);
  auVar230._0_4_ = auVar13._0_4_ * fVar122 + auVar92._0_4_ * fVar158 + auVar183._0_4_ * fVar186;
  auVar230._4_4_ = auVar13._4_4_ * fVar142 + auVar92._4_4_ * fVar185 + auVar183._4_4_ * fVar141;
  auVar230._8_4_ = auVar13._8_4_ * fVar166 + auVar92._8_4_ * fVar140 + auVar183._8_4_ * fVar163;
  auVar230._12_4_ = auVar13._12_4_ * fVar139 + auVar92._12_4_ * fVar161 + auVar183._12_4_ * fVar187;
  auVar204._0_4_ = (fVar143 + auVar85._0_4_) * 0.33333334;
  auVar204._4_4_ = (fVar159 + auVar85._4_4_) * 0.33333334;
  auVar204._8_4_ = (fVar162 + auVar85._8_4_) * 0.33333334;
  auVar204._12_4_ = (fVar164 + auVar85._12_4_) * 0.33333334;
  auVar57._4_4_ = local_578._4_4_;
  auVar57._0_4_ = local_578._0_4_;
  auVar57._8_4_ = fStack_570;
  auVar57._12_4_ = fStack_56c;
  _local_458 = vsubps_avx(auVar57,auVar204);
  local_2e8 = vsubps_avx(_local_458,auVar14);
  auVar183 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar92 = vmovshdup_avx(local_2e8);
  auVar13 = vmovsldup_avx(local_2e8);
  auVar213._0_4_ = auVar13._0_4_ * fVar122 + auVar92._0_4_ * fVar158 + fVar186 * auVar183._0_4_;
  auVar213._4_4_ = auVar13._4_4_ * fVar142 + auVar92._4_4_ * fVar185 + fVar141 * auVar183._4_4_;
  auVar213._8_4_ = auVar13._8_4_ * fVar166 + auVar92._8_4_ * fVar140 + fVar163 * auVar183._8_4_;
  auVar213._12_4_ = auVar13._12_4_ * fVar139 + auVar92._12_4_ * fVar161 + fVar187 * auVar183._12_4_;
  local_2f8 = vsubps_avx(auVar57,auVar14);
  auVar183 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar92 = vmovshdup_avx(local_2f8);
  auVar13 = vmovsldup_avx(local_2f8);
  auVar86._0_4_ = fVar122 * auVar13._0_4_ + fVar158 * auVar92._0_4_ + fVar186 * auVar183._0_4_;
  auVar86._4_4_ = fVar142 * auVar13._4_4_ + fVar185 * auVar92._4_4_ + fVar141 * auVar183._4_4_;
  auVar86._8_4_ = fVar166 * auVar13._8_4_ + fVar140 * auVar92._8_4_ + fVar163 * auVar183._8_4_;
  auVar86._12_4_ = fVar139 * auVar13._12_4_ + fVar161 * auVar92._12_4_ + fVar187 * auVar183._12_4_;
  auVar14 = vmovlhps_avx(_local_558,auVar265);
  auVar15 = vmovlhps_avx(_local_5a8,auVar230);
  auVar16 = vmovlhps_avx(auVar289,auVar213);
  _local_268 = vmovlhps_avx(auVar280,auVar86);
  auVar92 = vminps_avx(auVar14,auVar15);
  auVar13 = vminps_avx(auVar16,_local_268);
  auVar183 = vminps_avx(auVar92,auVar13);
  auVar92 = vmaxps_avx(auVar14,auVar15);
  auVar13 = vmaxps_avx(auVar16,_local_268);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  auVar13 = vshufpd_avx(auVar183,auVar183,3);
  auVar183 = vminps_avx(auVar183,auVar13);
  auVar13 = vshufpd_avx(auVar92,auVar92,3);
  auVar13 = vmaxps_avx(auVar92,auVar13);
  auVar92 = vandps_avx(auVar300._0_16_,auVar183);
  auVar13 = vandps_avx(auVar300._0_16_,auVar13);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  auVar13 = vmovshdup_avx(auVar92);
  auVar92 = vmaxss_avx(auVar13,auVar92);
  fVar122 = auVar92._0_4_ * 9.536743e-07;
  register0x00001548 = auVar280._0_8_;
  local_3e8 = auVar280._0_8_;
  local_278 = ZEXT416((uint)fVar122);
  auVar92 = vshufps_avx(ZEXT416((uint)fVar122),ZEXT416((uint)fVar122),0);
  local_138._16_16_ = auVar92;
  local_138._0_16_ = auVar92;
  auVar73._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
  auVar73._8_4_ = auVar92._8_4_ ^ 0x80000000;
  auVar73._12_4_ = auVar92._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar73;
  local_158._0_16_ = auVar73;
  local_328 = vshufps_avx(ZEXT416(uVar61),ZEXT416(uVar61),0);
  local_338 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar64 * 4 + 6)),0);
  bVar69 = false;
  uVar68 = 0;
  fVar122 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar15,auVar14);
  _local_248 = vsubps_avx(auVar16,auVar15);
  _local_258 = vsubps_avx(_local_268,auVar16);
  _local_348 = vsubps_avx(_local_408,_local_3f8);
  _local_358 = vsubps_avx(_local_448,_local_428);
  _local_368 = vsubps_avx(_local_458,_local_438);
  auVar58._4_4_ = local_578._4_4_;
  auVar58._0_4_ = local_578._0_4_;
  auVar58._8_4_ = fStack_570;
  auVar58._12_4_ = fStack_56c;
  _local_378 = vsubps_avx(auVar58,_local_418);
  local_5b8 = ZEXT816(0x3f80000000000000);
  local_308 = local_5b8;
  do {
    auVar92 = vshufps_avx(local_5b8,local_5b8,0x50);
    auVar295._8_4_ = 0x3f800000;
    auVar295._0_8_ = &DAT_3f8000003f800000;
    auVar295._12_4_ = 0x3f800000;
    auVar299._16_4_ = 0x3f800000;
    auVar299._0_16_ = auVar295;
    auVar299._20_4_ = 0x3f800000;
    auVar299._24_4_ = 0x3f800000;
    auVar299._28_4_ = 0x3f800000;
    auVar13 = vsubps_avx(auVar295,auVar92);
    fVar142 = auVar92._0_4_;
    fVar139 = auVar92._4_4_;
    fVar185 = auVar92._8_4_;
    fVar161 = auVar92._12_4_;
    fVar166 = auVar13._0_4_;
    fVar158 = auVar13._4_4_;
    fVar140 = auVar13._8_4_;
    fVar186 = auVar13._12_4_;
    auVar109._0_4_ = auVar265._0_4_ * fVar142 + fVar81 * fVar166;
    auVar109._4_4_ = auVar265._4_4_ * fVar139 + fVar103 * fVar158;
    auVar109._8_4_ = auVar265._0_4_ * fVar185 + fVar81 * fVar140;
    auVar109._12_4_ = auVar265._4_4_ * fVar161 + fVar103 * fVar186;
    auVar87._0_4_ = auVar230._0_4_ * fVar142 + fVar82 * fVar166;
    auVar87._4_4_ = auVar230._4_4_ * fVar139 + fVar104 * fVar158;
    auVar87._8_4_ = auVar230._0_4_ * fVar185 + fVar82 * fVar140;
    auVar87._12_4_ = auVar230._4_4_ * fVar161 + fVar104 * fVar186;
    auVar205._0_4_ = auVar213._0_4_ * fVar142 + auVar289._0_4_ * fVar166;
    auVar205._4_4_ = auVar213._4_4_ * fVar139 + auVar289._4_4_ * fVar158;
    auVar205._8_4_ = auVar213._0_4_ * fVar185 + auVar289._0_4_ * fVar140;
    auVar205._12_4_ = auVar213._4_4_ * fVar161 + auVar289._4_4_ * fVar186;
    auVar125._0_4_ = auVar86._0_4_ * fVar142 + local_3e8._0_4_ * fVar166;
    auVar125._4_4_ = auVar86._4_4_ * fVar139 + local_3e8._4_4_ * fVar158;
    auVar125._8_4_ = auVar86._0_4_ * fVar185 + local_3e8._8_4_ * fVar140;
    auVar125._12_4_ = auVar86._4_4_ * fVar161 + local_3e8._12_4_ * fVar186;
    auVar92 = vmovshdup_avx(local_308);
    auVar13 = vshufps_avx(local_308,local_308,0);
    auVar222._16_16_ = auVar13;
    auVar222._0_16_ = auVar13;
    auVar183 = vshufps_avx(local_308,local_308,0x55);
    auVar78._16_16_ = auVar183;
    auVar78._0_16_ = auVar183;
    auVar77 = vsubps_avx(auVar78,auVar222);
    auVar183 = vshufps_avx(auVar109,auVar109,0);
    auVar72 = vshufps_avx(auVar109,auVar109,0x55);
    auVar91 = vshufps_avx(auVar87,auVar87,0);
    auVar84 = vshufps_avx(auVar87,auVar87,0x55);
    auVar74 = vshufps_avx(auVar205,auVar205,0);
    auVar110 = vshufps_avx(auVar205,auVar205,0x55);
    auVar105 = vshufps_avx(auVar125,auVar125,0);
    auVar83 = vshufps_avx(auVar125,auVar125,0x55);
    auVar92 = ZEXT416((uint)((auVar92._0_4_ - local_308._0_4_) * 0.04761905));
    auVar92 = vshufps_avx(auVar92,auVar92,0);
    auVar239._0_4_ = auVar13._0_4_ + auVar77._0_4_ * 0.0;
    auVar239._4_4_ = auVar13._4_4_ + auVar77._4_4_ * 0.14285715;
    auVar239._8_4_ = auVar13._8_4_ + auVar77._8_4_ * 0.2857143;
    auVar239._12_4_ = auVar13._12_4_ + auVar77._12_4_ * 0.42857146;
    auVar239._16_4_ = auVar13._0_4_ + auVar77._16_4_ * 0.5714286;
    auVar239._20_4_ = auVar13._4_4_ + auVar77._20_4_ * 0.71428573;
    auVar239._24_4_ = auVar13._8_4_ + auVar77._24_4_ * 0.8571429;
    auVar239._28_4_ = auVar13._12_4_ + auVar77._28_4_;
    auVar19 = vsubps_avx(auVar299,auVar239);
    fVar241 = auVar91._0_4_;
    fVar143 = auVar91._4_4_;
    fVar160 = auVar91._8_4_;
    fVar165 = auVar91._12_4_;
    fVar142 = auVar19._0_4_;
    fVar185 = auVar19._4_4_;
    fVar141 = auVar19._8_4_;
    fVar240 = auVar19._12_4_;
    fVar285 = auVar183._12_4_;
    fVar159 = auVar19._16_4_;
    fVar162 = auVar19._20_4_;
    fVar164 = auVar19._24_4_;
    fVar197 = auVar84._0_4_;
    fVar198 = auVar84._4_4_;
    fVar199 = auVar84._8_4_;
    fVar276 = auVar84._12_4_;
    local_558._0_4_ = auVar72._0_4_;
    local_558._4_4_ = auVar72._4_4_;
    fStack_550 = auVar72._8_4_;
    fStack_54c = auVar72._12_4_;
    fVar166 = auVar74._0_4_;
    fVar158 = auVar74._4_4_;
    fVar161 = auVar74._8_4_;
    fVar163 = auVar74._12_4_;
    fVar248 = auVar239._0_4_ * fVar166 + fVar241 * fVar142;
    fVar256 = auVar239._4_4_ * fVar158 + fVar143 * fVar185;
    fVar257 = auVar239._8_4_ * fVar161 + fVar160 * fVar141;
    fVar258 = auVar239._12_4_ * fVar163 + fVar165 * fVar240;
    fVar259 = auVar239._16_4_ * fVar166 + fVar241 * fVar159;
    fVar260 = auVar239._20_4_ * fVar158 + fVar143 * fVar162;
    fVar261 = auVar239._24_4_ * fVar161 + fVar160 * fVar164;
    fVar139 = auVar110._0_4_;
    fVar140 = auVar110._4_4_;
    fVar186 = auVar110._8_4_;
    fVar187 = auVar110._12_4_;
    fVar262 = auVar239._0_4_ * fVar139 + fVar197 * fVar142;
    fVar267 = auVar239._4_4_ * fVar140 + fVar198 * fVar185;
    fVar268 = auVar239._8_4_ * fVar186 + fVar199 * fVar141;
    fVar269 = auVar239._12_4_ * fVar187 + fVar276 * fVar240;
    fVar270 = auVar239._16_4_ * fVar139 + fVar197 * fVar159;
    fVar272 = auVar239._20_4_ * fVar140 + fVar198 * fVar162;
    fVar274 = auVar239._24_4_ * fVar186 + fVar199 * fVar164;
    auVar13 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar72 = vshufps_avx(auVar109,auVar109,0xff);
    fVar121 = fVar163 + 0.0;
    auVar91 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar84 = vshufps_avx(auVar87,auVar87,0xff);
    auVar79._0_4_ =
         fVar142 * (fVar241 * auVar239._0_4_ + auVar183._0_4_ * fVar142) + auVar239._0_4_ * fVar248;
    auVar79._4_4_ =
         fVar185 * (fVar143 * auVar239._4_4_ + auVar183._4_4_ * fVar185) + auVar239._4_4_ * fVar256;
    auVar79._8_4_ =
         fVar141 * (fVar160 * auVar239._8_4_ + auVar183._8_4_ * fVar141) + auVar239._8_4_ * fVar257;
    auVar79._12_4_ =
         fVar240 * (fVar165 * auVar239._12_4_ + fVar285 * fVar240) + auVar239._12_4_ * fVar258;
    auVar79._16_4_ =
         fVar159 * (fVar241 * auVar239._16_4_ + auVar183._0_4_ * fVar159) +
         auVar239._16_4_ * fVar259;
    auVar79._20_4_ =
         fVar162 * (fVar143 * auVar239._20_4_ + auVar183._4_4_ * fVar162) +
         auVar239._20_4_ * fVar260;
    auVar79._24_4_ =
         fVar164 * (fVar160 * auVar239._24_4_ + auVar183._8_4_ * fVar164) +
         auVar239._24_4_ * fVar261;
    auVar79._28_4_ = fVar285 + 1.0 + fVar187;
    auVar135._0_4_ =
         fVar142 * (fVar197 * auVar239._0_4_ + fVar142 * (float)local_558._0_4_) +
         auVar239._0_4_ * fVar262;
    auVar135._4_4_ =
         fVar185 * (fVar198 * auVar239._4_4_ + fVar185 * (float)local_558._4_4_) +
         auVar239._4_4_ * fVar267;
    auVar135._8_4_ =
         fVar141 * (fVar199 * auVar239._8_4_ + fVar141 * fStack_550) + auVar239._8_4_ * fVar268;
    auVar135._12_4_ =
         fVar240 * (fVar276 * auVar239._12_4_ + fVar240 * fStack_54c) + auVar239._12_4_ * fVar269;
    auVar135._16_4_ =
         fVar159 * (fVar197 * auVar239._16_4_ + fVar159 * (float)local_558._0_4_) +
         auVar239._16_4_ * fVar270;
    auVar135._20_4_ =
         fVar162 * (fVar198 * auVar239._20_4_ + fVar162 * (float)local_558._4_4_) +
         auVar239._20_4_ * fVar272;
    auVar135._24_4_ =
         fVar164 * (fVar199 * auVar239._24_4_ + fVar164 * fStack_550) + auVar239._24_4_ * fVar274;
    auVar135._28_4_ = fVar285 + 1.0 + fVar187;
    auVar155._0_4_ =
         fVar142 * fVar248 + auVar239._0_4_ * (auVar105._0_4_ * auVar239._0_4_ + fVar142 * fVar166);
    auVar155._4_4_ =
         fVar185 * fVar256 + auVar239._4_4_ * (auVar105._4_4_ * auVar239._4_4_ + fVar185 * fVar158);
    auVar155._8_4_ =
         fVar141 * fVar257 + auVar239._8_4_ * (auVar105._8_4_ * auVar239._8_4_ + fVar141 * fVar161);
    auVar155._12_4_ =
         fVar240 * fVar258 +
         auVar239._12_4_ * (auVar105._12_4_ * auVar239._12_4_ + fVar240 * fVar163);
    auVar155._16_4_ =
         fVar159 * fVar259 +
         auVar239._16_4_ * (auVar105._0_4_ * auVar239._16_4_ + fVar159 * fVar166);
    auVar155._20_4_ =
         fVar162 * fVar260 +
         auVar239._20_4_ * (auVar105._4_4_ * auVar239._20_4_ + fVar162 * fVar158);
    auVar155._24_4_ =
         fVar164 * fVar261 +
         auVar239._24_4_ * (auVar105._8_4_ * auVar239._24_4_ + fVar164 * fVar161);
    auVar155._28_4_ = fVar187 + fVar121;
    auVar247._0_4_ =
         fVar142 * fVar262 + auVar239._0_4_ * (auVar83._0_4_ * auVar239._0_4_ + fVar142 * fVar139);
    auVar247._4_4_ =
         fVar185 * fVar267 + auVar239._4_4_ * (auVar83._4_4_ * auVar239._4_4_ + fVar185 * fVar140);
    auVar247._8_4_ =
         fVar141 * fVar268 + auVar239._8_4_ * (auVar83._8_4_ * auVar239._8_4_ + fVar141 * fVar186);
    auVar247._12_4_ =
         fVar240 * fVar269 +
         auVar239._12_4_ * (auVar83._12_4_ * auVar239._12_4_ + fVar240 * fVar187);
    auVar247._16_4_ =
         fVar159 * fVar270 + auVar239._16_4_ * (auVar83._0_4_ * auVar239._16_4_ + fVar159 * fVar139)
    ;
    auVar247._20_4_ =
         fVar162 * fVar272 + auVar239._20_4_ * (auVar83._4_4_ * auVar239._20_4_ + fVar162 * fVar140)
    ;
    auVar247._24_4_ =
         fVar164 * fVar274 + auVar239._24_4_ * (auVar83._8_4_ * auVar239._24_4_ + fVar164 * fVar186)
    ;
    auVar247._28_4_ = fVar121 + fVar187 + 0.0;
    local_78._0_4_ = fVar142 * auVar79._0_4_ + auVar239._0_4_ * auVar155._0_4_;
    local_78._4_4_ = fVar185 * auVar79._4_4_ + auVar239._4_4_ * auVar155._4_4_;
    local_78._8_4_ = fVar141 * auVar79._8_4_ + auVar239._8_4_ * auVar155._8_4_;
    local_78._12_4_ = fVar240 * auVar79._12_4_ + auVar239._12_4_ * auVar155._12_4_;
    local_78._16_4_ = fVar159 * auVar79._16_4_ + auVar239._16_4_ * auVar155._16_4_;
    local_78._20_4_ = fVar162 * auVar79._20_4_ + auVar239._20_4_ * auVar155._20_4_;
    local_78._24_4_ = fVar164 * auVar79._24_4_ + auVar239._24_4_ * auVar155._24_4_;
    local_78._28_4_ = fVar285 + fVar165 + fVar187 + 0.0;
    local_98._0_4_ = fVar142 * auVar135._0_4_ + auVar239._0_4_ * auVar247._0_4_;
    local_98._4_4_ = fVar185 * auVar135._4_4_ + auVar239._4_4_ * auVar247._4_4_;
    local_98._8_4_ = fVar141 * auVar135._8_4_ + auVar239._8_4_ * auVar247._8_4_;
    local_98._12_4_ = fVar240 * auVar135._12_4_ + auVar239._12_4_ * auVar247._12_4_;
    local_98._16_4_ = fVar159 * auVar135._16_4_ + auVar239._16_4_ * auVar247._16_4_;
    local_98._20_4_ = fVar162 * auVar135._20_4_ + auVar239._20_4_ * auVar247._20_4_;
    local_98._24_4_ = fVar164 * auVar135._24_4_ + auVar239._24_4_ * auVar247._24_4_;
    local_98._28_4_ = fVar285 + fVar165 + fVar121;
    auVar20 = vsubps_avx(auVar155,auVar79);
    auVar77 = vsubps_avx(auVar247,auVar135);
    local_4e8 = auVar92._0_4_;
    fStack_4e4 = auVar92._4_4_;
    fStack_4e0 = auVar92._8_4_;
    fStack_4dc = auVar92._12_4_;
    local_d8 = local_4e8 * auVar20._0_4_ * 3.0;
    fStack_d4 = fStack_4e4 * auVar20._4_4_ * 3.0;
    auVar21._4_4_ = fStack_d4;
    auVar21._0_4_ = local_d8;
    fStack_d0 = fStack_4e0 * auVar20._8_4_ * 3.0;
    auVar21._8_4_ = fStack_d0;
    fStack_cc = fStack_4dc * auVar20._12_4_ * 3.0;
    auVar21._12_4_ = fStack_cc;
    fStack_c8 = local_4e8 * auVar20._16_4_ * 3.0;
    auVar21._16_4_ = fStack_c8;
    fStack_c4 = fStack_4e4 * auVar20._20_4_ * 3.0;
    auVar21._20_4_ = fStack_c4;
    fStack_c0 = fStack_4e0 * auVar20._24_4_ * 3.0;
    auVar21._24_4_ = fStack_c0;
    auVar21._28_4_ = auVar20._28_4_;
    fVar256 = local_4e8 * auVar77._0_4_ * 3.0;
    fVar160 = fStack_4e4 * auVar77._4_4_ * 3.0;
    auVar22._4_4_ = fVar160;
    auVar22._0_4_ = fVar256;
    fVar257 = fStack_4e0 * auVar77._8_4_ * 3.0;
    auVar22._8_4_ = fVar257;
    fVar165 = fStack_4dc * auVar77._12_4_ * 3.0;
    auVar22._12_4_ = fVar165;
    fVar258 = local_4e8 * auVar77._16_4_ * 3.0;
    auVar22._16_4_ = fVar258;
    fVar259 = fStack_4e4 * auVar77._20_4_ * 3.0;
    auVar22._20_4_ = fVar259;
    fVar260 = fStack_4e0 * auVar77._24_4_ * 3.0;
    auVar22._24_4_ = fVar260;
    auVar22._28_4_ = auVar155._28_4_;
    auVar21 = vsubps_avx(local_78,auVar21);
    auVar77 = vperm2f128_avx(auVar21,auVar21,1);
    auVar77 = vshufps_avx(auVar77,auVar21,0x30);
    auVar77 = vshufps_avx(auVar21,auVar77,0x29);
    auVar22 = vsubps_avx(local_98,auVar22);
    auVar21 = vperm2f128_avx(auVar22,auVar22,1);
    auVar21 = vshufps_avx(auVar21,auVar22,0x30);
    auVar78 = vshufps_avx(auVar22,auVar21,0x29);
    fVar287 = auVar91._0_4_;
    fVar292 = auVar91._4_4_;
    fVar293 = auVar91._8_4_;
    fVar166 = auVar84._0_4_;
    fVar140 = auVar84._4_4_;
    fVar163 = auVar84._8_4_;
    fVar241 = auVar84._12_4_;
    fVar286 = auVar72._12_4_;
    auVar92 = vshufps_avx(auVar205,auVar205,0xaa);
    fVar139 = auVar92._0_4_;
    fVar161 = auVar92._4_4_;
    fVar187 = auVar92._8_4_;
    fVar248 = auVar92._12_4_;
    fVar269 = auVar239._0_4_ * fVar139 + fVar287 * fVar142;
    fVar270 = auVar239._4_4_ * fVar161 + fVar292 * fVar185;
    fVar272 = auVar239._8_4_ * fVar187 + fVar293 * fVar141;
    fVar274 = auVar239._12_4_ * fVar248 + auVar91._12_4_ * fVar240;
    fVar271 = auVar239._16_4_ * fVar139 + fVar287 * fVar159;
    fVar273 = auVar239._20_4_ * fVar161 + fVar292 * fVar162;
    fVar275 = auVar239._24_4_ * fVar187 + fVar293 * fVar164;
    fVar276 = fVar286 + fVar285 + fVar276;
    auVar92 = vshufps_avx(auVar205,auVar205,0xff);
    fVar158 = auVar92._0_4_;
    fVar186 = auVar92._4_4_;
    fVar121 = auVar92._8_4_;
    fVar143 = auVar92._12_4_;
    fVar261 = auVar239._0_4_ * fVar158 + fVar142 * fVar166;
    fVar197 = auVar239._4_4_ * fVar186 + fVar185 * fVar140;
    fVar262 = auVar239._8_4_ * fVar121 + fVar141 * fVar163;
    fVar198 = auVar239._12_4_ * fVar143 + fVar240 * fVar241;
    fVar267 = auVar239._16_4_ * fVar158 + fVar159 * fVar166;
    fVar199 = auVar239._20_4_ * fVar186 + fVar162 * fVar140;
    fVar268 = auVar239._24_4_ * fVar121 + fVar164 * fVar163;
    auVar92 = vshufps_avx(auVar125,auVar125,0xaa);
    auVar183 = vshufps_avx(auVar125,auVar125,0xff);
    fVar285 = auVar183._12_4_;
    auVar80._0_4_ =
         auVar239._0_4_ * fVar269 + fVar142 * (fVar287 * auVar239._0_4_ + auVar13._0_4_ * fVar142);
    auVar80._4_4_ =
         auVar239._4_4_ * fVar270 + fVar185 * (fVar292 * auVar239._4_4_ + auVar13._4_4_ * fVar185);
    auVar80._8_4_ =
         auVar239._8_4_ * fVar272 + fVar141 * (fVar293 * auVar239._8_4_ + auVar13._8_4_ * fVar141);
    auVar80._12_4_ =
         auVar239._12_4_ * fVar274 +
         fVar240 * (auVar91._12_4_ * auVar239._12_4_ + auVar13._12_4_ * fVar240);
    auVar80._16_4_ =
         auVar239._16_4_ * fVar271 + fVar159 * (fVar287 * auVar239._16_4_ + auVar13._0_4_ * fVar159)
    ;
    auVar80._20_4_ =
         auVar239._20_4_ * fVar273 + fVar162 * (fVar292 * auVar239._20_4_ + auVar13._4_4_ * fVar162)
    ;
    auVar80._24_4_ =
         auVar239._24_4_ * fVar275 + fVar164 * (fVar293 * auVar239._24_4_ + auVar13._8_4_ * fVar164)
    ;
    auVar80._28_4_ = fVar285 + auVar22._28_4_ + auVar21._28_4_;
    auVar284._0_4_ =
         auVar239._0_4_ * fVar261 + fVar142 * (auVar239._0_4_ * fVar166 + auVar72._0_4_ * fVar142);
    auVar284._4_4_ =
         auVar239._4_4_ * fVar197 + fVar185 * (auVar239._4_4_ * fVar140 + auVar72._4_4_ * fVar185);
    auVar284._8_4_ =
         auVar239._8_4_ * fVar262 + fVar141 * (auVar239._8_4_ * fVar163 + auVar72._8_4_ * fVar141);
    auVar284._12_4_ =
         auVar239._12_4_ * fVar198 + fVar240 * (auVar239._12_4_ * fVar241 + fVar286 * fVar240);
    auVar284._16_4_ =
         auVar239._16_4_ * fVar267 + fVar159 * (auVar239._16_4_ * fVar166 + auVar72._0_4_ * fVar159)
    ;
    auVar284._20_4_ =
         auVar239._20_4_ * fVar199 + fVar162 * (auVar239._20_4_ * fVar140 + auVar72._4_4_ * fVar162)
    ;
    auVar284._24_4_ =
         auVar239._24_4_ * fVar268 + fVar164 * (auVar239._24_4_ * fVar163 + auVar72._8_4_ * fVar164)
    ;
    auVar284._28_4_ = fVar285 + auVar21._28_4_ + auVar155._28_4_;
    auVar21 = vperm2f128_avx(local_78,local_78,1);
    auVar21 = vshufps_avx(auVar21,local_78,0x30);
    _local_3d8 = vshufps_avx(local_78,auVar21,0x29);
    auVar156._0_4_ =
         fVar142 * fVar269 + auVar239._0_4_ * (auVar92._0_4_ * auVar239._0_4_ + fVar142 * fVar139);
    auVar156._4_4_ =
         fVar185 * fVar270 + auVar239._4_4_ * (auVar92._4_4_ * auVar239._4_4_ + fVar185 * fVar161);
    auVar156._8_4_ =
         fVar141 * fVar272 + auVar239._8_4_ * (auVar92._8_4_ * auVar239._8_4_ + fVar141 * fVar187);
    auVar156._12_4_ =
         fVar240 * fVar274 +
         auVar239._12_4_ * (auVar92._12_4_ * auVar239._12_4_ + fVar240 * fVar248);
    auVar156._16_4_ =
         fVar159 * fVar271 + auVar239._16_4_ * (auVar92._0_4_ * auVar239._16_4_ + fVar159 * fVar139)
    ;
    auVar156._20_4_ =
         fVar162 * fVar273 + auVar239._20_4_ * (auVar92._4_4_ * auVar239._20_4_ + fVar162 * fVar161)
    ;
    auVar156._24_4_ =
         fVar164 * fVar275 + auVar239._24_4_ * (auVar92._8_4_ * auVar239._24_4_ + fVar164 * fVar187)
    ;
    auVar156._28_4_ = fVar276 + auVar92._12_4_ + fVar248;
    auVar196._0_4_ =
         fVar142 * fVar261 + auVar239._0_4_ * (auVar183._0_4_ * auVar239._0_4_ + fVar142 * fVar158);
    auVar196._4_4_ =
         fVar185 * fVar197 + auVar239._4_4_ * (auVar183._4_4_ * auVar239._4_4_ + fVar185 * fVar186);
    auVar196._8_4_ =
         fVar141 * fVar262 + auVar239._8_4_ * (auVar183._8_4_ * auVar239._8_4_ + fVar141 * fVar121);
    auVar196._12_4_ =
         fVar240 * fVar198 + auVar239._12_4_ * (fVar285 * auVar239._12_4_ + fVar240 * fVar143);
    auVar196._16_4_ =
         fVar159 * fVar267 +
         auVar239._16_4_ * (auVar183._0_4_ * auVar239._16_4_ + fVar159 * fVar158);
    auVar196._20_4_ =
         fVar162 * fVar199 +
         auVar239._20_4_ * (auVar183._4_4_ * auVar239._20_4_ + fVar162 * fVar186);
    auVar196._24_4_ =
         fVar164 * fVar268 +
         auVar239._24_4_ * (auVar183._8_4_ * auVar239._24_4_ + fVar164 * fVar121);
    auVar196._28_4_ = fVar286 + fVar241 + fVar285 + fVar143;
    auVar208._0_4_ = fVar142 * auVar80._0_4_ + auVar239._0_4_ * auVar156._0_4_;
    auVar208._4_4_ = fVar185 * auVar80._4_4_ + auVar239._4_4_ * auVar156._4_4_;
    auVar208._8_4_ = fVar141 * auVar80._8_4_ + auVar239._8_4_ * auVar156._8_4_;
    auVar208._12_4_ = fVar240 * auVar80._12_4_ + auVar239._12_4_ * auVar156._12_4_;
    auVar208._16_4_ = fVar159 * auVar80._16_4_ + auVar239._16_4_ * auVar156._16_4_;
    auVar208._20_4_ = fVar162 * auVar80._20_4_ + auVar239._20_4_ * auVar156._20_4_;
    auVar208._24_4_ = fVar164 * auVar80._24_4_ + auVar239._24_4_ * auVar156._24_4_;
    auVar208._28_4_ = fVar276 + fVar285 + fVar143;
    auVar223._0_4_ = fVar142 * auVar284._0_4_ + auVar239._0_4_ * auVar196._0_4_;
    auVar223._4_4_ = fVar185 * auVar284._4_4_ + auVar239._4_4_ * auVar196._4_4_;
    auVar223._8_4_ = fVar141 * auVar284._8_4_ + auVar239._8_4_ * auVar196._8_4_;
    auVar223._12_4_ = fVar240 * auVar284._12_4_ + auVar239._12_4_ * auVar196._12_4_;
    auVar223._16_4_ = fVar159 * auVar284._16_4_ + auVar239._16_4_ * auVar196._16_4_;
    auVar223._20_4_ = fVar162 * auVar284._20_4_ + auVar239._20_4_ * auVar196._20_4_;
    auVar223._24_4_ = fVar164 * auVar284._24_4_ + auVar239._24_4_ * auVar196._24_4_;
    auVar223._28_4_ = auVar19._28_4_ + auVar239._28_4_;
    auVar21 = vsubps_avx(auVar156,auVar80);
    auVar19 = vsubps_avx(auVar196,auVar284);
    local_f8 = local_4e8 * auVar21._0_4_ * 3.0;
    fStack_f4 = fStack_4e4 * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_f4;
    auVar17._0_4_ = local_f8;
    fStack_f0 = fStack_4e0 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_f0;
    fStack_ec = fStack_4dc * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_ec;
    fStack_e8 = local_4e8 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_e8;
    fStack_e4 = fStack_4e4 * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_e4;
    fStack_e0 = fStack_4e0 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_e0;
    auVar17._28_4_ = auVar196._28_4_;
    local_118 = local_4e8 * auVar19._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar19._4_4_ * 3.0;
    auVar18._4_4_ = fStack_114;
    auVar18._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar19._8_4_ * 3.0;
    auVar18._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar19._12_4_ * 3.0;
    auVar18._12_4_ = fStack_10c;
    local_4e8 = local_4e8 * auVar19._16_4_ * 3.0;
    auVar18._16_4_ = local_4e8;
    fStack_4e4 = fStack_4e4 * auVar19._20_4_ * 3.0;
    auVar18._20_4_ = fStack_4e4;
    fStack_4e0 = fStack_4e0 * auVar19._24_4_ * 3.0;
    auVar18._24_4_ = fStack_4e0;
    auVar18._28_4_ = fStack_4dc;
    auVar21 = vperm2f128_avx(auVar208,auVar208,1);
    auVar21 = vshufps_avx(auVar21,auVar208,0x30);
    auVar79 = vshufps_avx(auVar208,auVar21,0x29);
    auVar19 = vsubps_avx(auVar208,auVar17);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar17 = vshufps_avx(auVar19,auVar21,0x29);
    auVar19 = vsubps_avx(auVar223,auVar18);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar18 = vshufps_avx(auVar19,auVar21,0x29);
    auVar22 = vsubps_avx(auVar208,local_78);
    auVar23 = vsubps_avx(auVar79,_local_3d8);
    fVar142 = auVar23._0_4_ + auVar22._0_4_;
    fVar166 = auVar23._4_4_ + auVar22._4_4_;
    fVar139 = auVar23._8_4_ + auVar22._8_4_;
    fVar158 = auVar23._12_4_ + auVar22._12_4_;
    fVar185 = auVar23._16_4_ + auVar22._16_4_;
    fVar140 = auVar23._20_4_ + auVar22._20_4_;
    fVar161 = auVar23._24_4_ + auVar22._24_4_;
    auVar19 = vperm2f128_avx(local_98,local_98,1);
    auVar19 = vshufps_avx(auVar19,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar223,auVar223,1);
    auVar19 = vshufps_avx(auVar19,auVar223,0x30);
    auVar80 = vshufps_avx(auVar223,auVar19,0x29);
    auVar19 = vsubps_avx(auVar223,local_98);
    auVar135 = vsubps_avx(auVar80,local_b8);
    fVar186 = auVar19._0_4_ + auVar135._0_4_;
    fVar141 = auVar19._4_4_ + auVar135._4_4_;
    fVar163 = auVar19._8_4_ + auVar135._8_4_;
    fVar187 = auVar19._12_4_ + auVar135._12_4_;
    fVar121 = auVar19._16_4_ + auVar135._16_4_;
    fVar240 = auVar19._20_4_ + auVar135._20_4_;
    fVar241 = auVar19._24_4_ + auVar135._24_4_;
    fVar248 = auVar19._28_4_;
    auVar19._4_4_ = local_98._4_4_ * fVar166;
    auVar19._0_4_ = local_98._0_4_ * fVar142;
    auVar19._8_4_ = local_98._8_4_ * fVar139;
    auVar19._12_4_ = local_98._12_4_ * fVar158;
    auVar19._16_4_ = local_98._16_4_ * fVar185;
    auVar19._20_4_ = local_98._20_4_ * fVar140;
    auVar19._24_4_ = local_98._24_4_ * fVar161;
    auVar19._28_4_ = fVar248;
    auVar24._4_4_ = fVar141 * local_78._4_4_;
    auVar24._0_4_ = fVar186 * local_78._0_4_;
    auVar24._8_4_ = fVar163 * local_78._8_4_;
    auVar24._12_4_ = fVar187 * local_78._12_4_;
    auVar24._16_4_ = fVar121 * local_78._16_4_;
    auVar24._20_4_ = fVar240 * local_78._20_4_;
    auVar24._24_4_ = fVar241 * local_78._24_4_;
    auVar24._28_4_ = auVar21._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar24);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar20._28_4_;
    fVar256 = local_98._0_4_ + fVar256;
    fVar160 = local_98._4_4_ + fVar160;
    fVar257 = local_98._8_4_ + fVar257;
    fVar165 = local_98._12_4_ + fVar165;
    fVar258 = local_98._16_4_ + fVar258;
    fVar259 = local_98._20_4_ + fVar259;
    fVar260 = local_98._24_4_ + fVar260;
    auVar20._4_4_ = fVar160 * fVar166;
    auVar20._0_4_ = fVar256 * fVar142;
    auVar20._8_4_ = fVar257 * fVar139;
    auVar20._12_4_ = fVar165 * fVar158;
    auVar20._16_4_ = fVar258 * fVar185;
    auVar20._20_4_ = fVar259 * fVar140;
    auVar20._24_4_ = fVar260 * fVar161;
    auVar20._28_4_ = fVar248;
    auVar25._4_4_ = fVar141 * fStack_d4;
    auVar25._0_4_ = fVar186 * local_d8;
    auVar25._8_4_ = fVar163 * fStack_d0;
    auVar25._12_4_ = fVar187 * fStack_cc;
    auVar25._16_4_ = fVar121 * fStack_c8;
    auVar25._20_4_ = fVar240 * fStack_c4;
    auVar25._24_4_ = fVar241 * fStack_c0;
    auVar25._28_4_ = fStack_bc;
    auVar20 = vsubps_avx(auVar20,auVar25);
    auVar26._4_4_ = auVar78._4_4_ * fVar166;
    auVar26._0_4_ = auVar78._0_4_ * fVar142;
    auVar26._8_4_ = auVar78._8_4_ * fVar139;
    auVar26._12_4_ = auVar78._12_4_ * fVar158;
    auVar26._16_4_ = auVar78._16_4_ * fVar185;
    auVar26._20_4_ = auVar78._20_4_ * fVar140;
    auVar26._24_4_ = auVar78._24_4_ * fVar161;
    auVar26._28_4_ = fVar248;
    local_558._0_4_ = auVar77._0_4_;
    local_558._4_4_ = auVar77._4_4_;
    fStack_550 = auVar77._8_4_;
    fStack_54c = auVar77._12_4_;
    fStack_548 = auVar77._16_4_;
    fStack_544 = auVar77._20_4_;
    fStack_540 = auVar77._24_4_;
    auVar27._4_4_ = fVar141 * (float)local_558._4_4_;
    auVar27._0_4_ = fVar186 * (float)local_558._0_4_;
    auVar27._8_4_ = fVar163 * fStack_550;
    auVar27._12_4_ = fVar187 * fStack_54c;
    auVar27._16_4_ = fVar121 * fStack_548;
    auVar27._20_4_ = fVar240 * fStack_544;
    auVar27._24_4_ = fVar241 * fStack_540;
    auVar27._28_4_ = 0x40400000;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_b8._4_4_ * fVar166;
    auVar28._0_4_ = local_b8._0_4_ * fVar142;
    auVar28._8_4_ = local_b8._8_4_ * fVar139;
    auVar28._12_4_ = local_b8._12_4_ * fVar158;
    auVar28._16_4_ = local_b8._16_4_ * fVar185;
    auVar28._20_4_ = local_b8._20_4_ * fVar140;
    auVar28._24_4_ = local_b8._24_4_ * fVar161;
    auVar28._28_4_ = fVar248;
    auVar29._4_4_ = local_3d8._4_4_ * fVar141;
    auVar29._0_4_ = local_3d8._0_4_ * fVar186;
    auVar29._8_4_ = local_3d8._8_4_ * fVar163;
    auVar29._12_4_ = local_3d8._12_4_ * fVar187;
    auVar29._16_4_ = local_3d8._16_4_ * fVar121;
    auVar29._20_4_ = local_3d8._20_4_ * fVar240;
    auVar29._24_4_ = local_3d8._24_4_ * fVar241;
    auVar29._28_4_ = local_b8._28_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar223._4_4_ * fVar166;
    auVar30._0_4_ = auVar223._0_4_ * fVar142;
    auVar30._8_4_ = auVar223._8_4_ * fVar139;
    auVar30._12_4_ = auVar223._12_4_ * fVar158;
    auVar30._16_4_ = auVar223._16_4_ * fVar185;
    auVar30._20_4_ = auVar223._20_4_ * fVar140;
    auVar30._24_4_ = auVar223._24_4_ * fVar161;
    auVar30._28_4_ = fVar248;
    auVar31._4_4_ = fVar141 * auVar208._4_4_;
    auVar31._0_4_ = fVar186 * auVar208._0_4_;
    auVar31._8_4_ = fVar163 * auVar208._8_4_;
    auVar31._12_4_ = fVar187 * auVar208._12_4_;
    auVar31._16_4_ = fVar121 * auVar208._16_4_;
    auVar31._20_4_ = fVar240 * auVar208._20_4_;
    auVar31._24_4_ = fVar241 * auVar208._24_4_;
    auVar31._28_4_ = auVar78._28_4_;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_f8 = auVar208._0_4_ + local_f8;
    fStack_f4 = auVar208._4_4_ + fStack_f4;
    fStack_f0 = auVar208._8_4_ + fStack_f0;
    fStack_ec = auVar208._12_4_ + fStack_ec;
    fStack_e8 = auVar208._16_4_ + fStack_e8;
    fStack_e4 = auVar208._20_4_ + fStack_e4;
    fStack_e0 = auVar208._24_4_ + fStack_e0;
    fStack_dc = auVar208._28_4_ + auVar196._28_4_;
    local_118 = auVar223._0_4_ + local_118;
    fStack_114 = auVar223._4_4_ + fStack_114;
    fStack_110 = auVar223._8_4_ + fStack_110;
    fStack_10c = auVar223._12_4_ + fStack_10c;
    fStack_108 = auVar223._16_4_ + local_4e8;
    fStack_104 = auVar223._20_4_ + fStack_4e4;
    fStack_100 = auVar223._24_4_ + fStack_4e0;
    fStack_fc = auVar223._28_4_ + fStack_4dc;
    auVar32._4_4_ = fStack_114 * fVar166;
    auVar32._0_4_ = local_118 * fVar142;
    auVar32._8_4_ = fStack_110 * fVar139;
    auVar32._12_4_ = fStack_10c * fVar158;
    auVar32._16_4_ = fStack_108 * fVar185;
    auVar32._20_4_ = fStack_104 * fVar140;
    auVar32._24_4_ = fStack_100 * fVar161;
    auVar32._28_4_ = auVar223._28_4_ + fStack_4dc;
    auVar33._4_4_ = fStack_f4 * fVar141;
    auVar33._0_4_ = local_f8 * fVar186;
    auVar33._8_4_ = fStack_f0 * fVar163;
    auVar33._12_4_ = fStack_ec * fVar187;
    auVar33._16_4_ = fStack_e8 * fVar121;
    auVar33._20_4_ = fStack_e4 * fVar240;
    auVar33._24_4_ = fStack_e0 * fVar241;
    auVar33._28_4_ = fStack_dc;
    auVar27 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar18._4_4_ * fVar166;
    auVar34._0_4_ = auVar18._0_4_ * fVar142;
    auVar34._8_4_ = auVar18._8_4_ * fVar139;
    auVar34._12_4_ = auVar18._12_4_ * fVar158;
    auVar34._16_4_ = auVar18._16_4_ * fVar185;
    auVar34._20_4_ = auVar18._20_4_ * fVar140;
    auVar34._24_4_ = auVar18._24_4_ * fVar161;
    auVar34._28_4_ = fStack_dc;
    auVar35._4_4_ = fVar141 * auVar17._4_4_;
    auVar35._0_4_ = fVar186 * auVar17._0_4_;
    auVar35._8_4_ = fVar163 * auVar17._8_4_;
    auVar35._12_4_ = fVar187 * auVar17._12_4_;
    auVar35._16_4_ = fVar121 * auVar17._16_4_;
    auVar35._20_4_ = fVar240 * auVar17._20_4_;
    auVar35._24_4_ = fVar241 * auVar17._24_4_;
    auVar35._28_4_ = auVar17._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar80._4_4_ * fVar166;
    auVar36._0_4_ = auVar80._0_4_ * fVar142;
    auVar36._8_4_ = auVar80._8_4_ * fVar139;
    auVar36._12_4_ = auVar80._12_4_ * fVar158;
    auVar36._16_4_ = auVar80._16_4_ * fVar185;
    auVar36._20_4_ = auVar80._20_4_ * fVar140;
    auVar36._24_4_ = auVar80._24_4_ * fVar161;
    auVar36._28_4_ = auVar23._28_4_ + auVar22._28_4_;
    auVar23._4_4_ = auVar79._4_4_ * fVar141;
    auVar23._0_4_ = auVar79._0_4_ * fVar186;
    auVar23._8_4_ = auVar79._8_4_ * fVar163;
    auVar23._12_4_ = auVar79._12_4_ * fVar187;
    auVar23._16_4_ = auVar79._16_4_ * fVar121;
    auVar23._20_4_ = auVar79._20_4_ * fVar240;
    auVar23._24_4_ = auVar79._24_4_ * fVar241;
    auVar23._28_4_ = fVar248 + auVar135._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar21 = vminps_avx(auVar19,auVar20);
    auVar77 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar24,auVar25);
    auVar77 = vmaxps_avx(auVar77,auVar21);
    auVar20 = vminps_avx(auVar26,auVar27);
    auVar21 = vmaxps_avx(auVar26,auVar27);
    auVar22 = vminps_avx(auVar28,auVar23);
    auVar20 = vminps_avx(auVar20,auVar22);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar28,auVar23);
    auVar21 = vmaxps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar77,auVar21);
    auVar77 = vcmpps_avx(auVar20,local_138,2);
    auVar21 = vcmpps_avx(auVar21,local_158,5);
    auVar77 = vandps_avx(auVar21,auVar77);
    auVar21 = local_228 & auVar77;
    uVar62 = 0;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar21 = vsubps_avx(_local_3d8,local_78);
      auVar19 = vsubps_avx(auVar79,auVar208);
      fVar166 = auVar21._0_4_ + auVar19._0_4_;
      fVar139 = auVar21._4_4_ + auVar19._4_4_;
      fVar158 = auVar21._8_4_ + auVar19._8_4_;
      fVar185 = auVar21._12_4_ + auVar19._12_4_;
      fVar140 = auVar21._16_4_ + auVar19._16_4_;
      fVar161 = auVar21._20_4_ + auVar19._20_4_;
      fVar186 = auVar21._24_4_ + auVar19._24_4_;
      auVar20 = vsubps_avx(local_b8,local_98);
      auVar22 = vsubps_avx(auVar80,auVar223);
      fVar141 = auVar20._0_4_ + auVar22._0_4_;
      fVar163 = auVar20._4_4_ + auVar22._4_4_;
      fVar187 = auVar20._8_4_ + auVar22._8_4_;
      fVar121 = auVar20._12_4_ + auVar22._12_4_;
      fVar240 = auVar20._16_4_ + auVar22._16_4_;
      fVar241 = auVar20._20_4_ + auVar22._20_4_;
      fVar248 = auVar20._24_4_ + auVar22._24_4_;
      fVar142 = auVar22._28_4_;
      auVar37._4_4_ = local_98._4_4_ * fVar139;
      auVar37._0_4_ = local_98._0_4_ * fVar166;
      auVar37._8_4_ = local_98._8_4_ * fVar158;
      auVar37._12_4_ = local_98._12_4_ * fVar185;
      auVar37._16_4_ = local_98._16_4_ * fVar140;
      auVar37._20_4_ = local_98._20_4_ * fVar161;
      auVar37._24_4_ = local_98._24_4_ * fVar186;
      auVar37._28_4_ = local_98._28_4_;
      auVar38._4_4_ = local_78._4_4_ * fVar163;
      auVar38._0_4_ = local_78._0_4_ * fVar141;
      auVar38._8_4_ = local_78._8_4_ * fVar187;
      auVar38._12_4_ = local_78._12_4_ * fVar121;
      auVar38._16_4_ = local_78._16_4_ * fVar240;
      auVar38._20_4_ = local_78._20_4_ * fVar241;
      auVar38._24_4_ = local_78._24_4_ * fVar248;
      auVar38._28_4_ = local_78._28_4_;
      auVar22 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar160 * fVar139;
      auVar39._0_4_ = fVar256 * fVar166;
      auVar39._8_4_ = fVar257 * fVar158;
      auVar39._12_4_ = fVar165 * fVar185;
      auVar39._16_4_ = fVar258 * fVar140;
      auVar39._20_4_ = fVar259 * fVar161;
      auVar39._24_4_ = fVar260 * fVar186;
      auVar39._28_4_ = local_98._28_4_;
      auVar40._4_4_ = fVar163 * fStack_d4;
      auVar40._0_4_ = fVar141 * local_d8;
      auVar40._8_4_ = fVar187 * fStack_d0;
      auVar40._12_4_ = fVar121 * fStack_cc;
      auVar40._16_4_ = fVar240 * fStack_c8;
      auVar40._20_4_ = fVar241 * fStack_c4;
      auVar40._24_4_ = fVar248 * fStack_c0;
      auVar40._28_4_ = fVar142;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar139 * auVar78._4_4_;
      auVar41._0_4_ = fVar166 * auVar78._0_4_;
      auVar41._8_4_ = fVar158 * auVar78._8_4_;
      auVar41._12_4_ = fVar185 * auVar78._12_4_;
      auVar41._16_4_ = fVar140 * auVar78._16_4_;
      auVar41._20_4_ = fVar161 * auVar78._20_4_;
      auVar41._24_4_ = fVar186 * auVar78._24_4_;
      auVar41._28_4_ = fVar142;
      auVar42._4_4_ = fVar163 * (float)local_558._4_4_;
      auVar42._0_4_ = fVar141 * (float)local_558._0_4_;
      auVar42._8_4_ = fVar187 * fStack_550;
      auVar42._12_4_ = fVar121 * fStack_54c;
      auVar42._16_4_ = fVar240 * fStack_548;
      auVar42._20_4_ = fVar241 * fStack_544;
      auVar42._24_4_ = fVar248 * fStack_540;
      auVar42._28_4_ = local_98._28_4_ + auVar155._28_4_;
      auVar78 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_b8._4_4_ * fVar139;
      auVar43._0_4_ = local_b8._0_4_ * fVar166;
      auVar43._8_4_ = local_b8._8_4_ * fVar158;
      auVar43._12_4_ = local_b8._12_4_ * fVar185;
      auVar43._16_4_ = local_b8._16_4_ * fVar140;
      auVar43._20_4_ = local_b8._20_4_ * fVar161;
      auVar43._24_4_ = local_b8._24_4_ * fVar186;
      auVar43._28_4_ = local_98._28_4_ + auVar155._28_4_;
      auVar44._4_4_ = local_3d8._4_4_ * fVar163;
      auVar44._0_4_ = local_3d8._0_4_ * fVar141;
      auVar44._8_4_ = local_3d8._8_4_ * fVar187;
      auVar44._12_4_ = local_3d8._12_4_ * fVar121;
      auVar44._16_4_ = local_3d8._16_4_ * fVar240;
      auVar44._20_4_ = local_3d8._20_4_ * fVar241;
      uVar3 = local_3d8._28_4_;
      auVar44._24_4_ = local_3d8._24_4_ * fVar248;
      auVar44._28_4_ = uVar3;
      auVar135 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar223._4_4_ * fVar139;
      auVar45._0_4_ = auVar223._0_4_ * fVar166;
      auVar45._8_4_ = auVar223._8_4_ * fVar158;
      auVar45._12_4_ = auVar223._12_4_ * fVar185;
      auVar45._16_4_ = auVar223._16_4_ * fVar140;
      auVar45._20_4_ = auVar223._20_4_ * fVar161;
      auVar45._24_4_ = auVar223._24_4_ * fVar186;
      auVar45._28_4_ = auVar223._28_4_;
      auVar46._4_4_ = auVar208._4_4_ * fVar163;
      auVar46._0_4_ = auVar208._0_4_ * fVar141;
      auVar46._8_4_ = auVar208._8_4_ * fVar187;
      auVar46._12_4_ = auVar208._12_4_ * fVar121;
      auVar46._16_4_ = auVar208._16_4_ * fVar240;
      auVar46._20_4_ = auVar208._20_4_ * fVar241;
      auVar46._24_4_ = auVar208._24_4_ * fVar248;
      auVar46._28_4_ = auVar208._28_4_;
      auVar24 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar139 * fStack_114;
      auVar47._0_4_ = fVar166 * local_118;
      auVar47._8_4_ = fVar158 * fStack_110;
      auVar47._12_4_ = fVar185 * fStack_10c;
      auVar47._16_4_ = fVar140 * fStack_108;
      auVar47._20_4_ = fVar161 * fStack_104;
      auVar47._24_4_ = fVar186 * fStack_100;
      auVar47._28_4_ = auVar223._28_4_;
      auVar48._4_4_ = fVar163 * fStack_f4;
      auVar48._0_4_ = fVar141 * local_f8;
      auVar48._8_4_ = fVar187 * fStack_f0;
      auVar48._12_4_ = fVar121 * fStack_ec;
      auVar48._16_4_ = fVar240 * fStack_e8;
      auVar48._20_4_ = fVar241 * fStack_e4;
      auVar48._24_4_ = fVar248 * fStack_e0;
      auVar48._28_4_ = uVar3;
      auVar25 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar139 * auVar18._4_4_;
      auVar49._0_4_ = fVar166 * auVar18._0_4_;
      auVar49._8_4_ = fVar158 * auVar18._8_4_;
      auVar49._12_4_ = fVar185 * auVar18._12_4_;
      auVar49._16_4_ = fVar140 * auVar18._16_4_;
      auVar49._20_4_ = fVar161 * auVar18._20_4_;
      auVar49._24_4_ = fVar186 * auVar18._24_4_;
      auVar49._28_4_ = uVar3;
      auVar50._4_4_ = fVar163 * auVar17._4_4_;
      auVar50._0_4_ = fVar141 * auVar17._0_4_;
      auVar50._8_4_ = fVar187 * auVar17._8_4_;
      auVar50._12_4_ = fVar121 * auVar17._12_4_;
      auVar50._16_4_ = fVar240 * auVar17._16_4_;
      auVar50._20_4_ = fVar241 * auVar17._20_4_;
      auVar50._24_4_ = fVar248 * auVar17._24_4_;
      auVar50._28_4_ = local_b8._28_4_;
      auVar17 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar80._4_4_ * fVar139;
      auVar51._0_4_ = auVar80._0_4_ * fVar166;
      auVar51._8_4_ = auVar80._8_4_ * fVar158;
      auVar51._12_4_ = auVar80._12_4_ * fVar185;
      auVar51._16_4_ = auVar80._16_4_ * fVar140;
      auVar51._20_4_ = auVar80._20_4_ * fVar161;
      auVar51._24_4_ = auVar80._24_4_ * fVar186;
      auVar51._28_4_ = auVar21._28_4_ + auVar19._28_4_;
      auVar52._4_4_ = auVar79._4_4_ * fVar163;
      auVar52._0_4_ = auVar79._0_4_ * fVar141;
      auVar52._8_4_ = auVar79._8_4_ * fVar187;
      auVar52._12_4_ = auVar79._12_4_ * fVar121;
      auVar52._16_4_ = auVar79._16_4_ * fVar240;
      auVar52._20_4_ = auVar79._20_4_ * fVar241;
      auVar52._24_4_ = auVar79._24_4_ * fVar248;
      auVar52._28_4_ = auVar20._28_4_ + fVar142;
      auVar79 = vsubps_avx(auVar51,auVar52);
      auVar19 = vminps_avx(auVar22,auVar23);
      auVar21 = vmaxps_avx(auVar22,auVar23);
      auVar20 = vminps_avx(auVar78,auVar135);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar78,auVar135);
      auVar21 = vmaxps_avx(auVar21,auVar19);
      auVar22 = vminps_avx(auVar24,auVar25);
      auVar19 = vmaxps_avx(auVar24,auVar25);
      auVar78 = vminps_avx(auVar17,auVar79);
      auVar22 = vminps_avx(auVar22,auVar78);
      auVar22 = vminps_avx(auVar20,auVar22);
      auVar20 = vmaxps_avx(auVar17,auVar79);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar21,auVar19);
      auVar21 = vcmpps_avx(auVar22,local_138,2);
      auVar19 = vcmpps_avx(auVar19,local_158,5);
      auVar21 = vandps_avx(auVar19,auVar21);
      auVar77 = vandps_avx(auVar77,local_228);
      auVar19 = auVar77 & auVar21;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar77 = vandps_avx(auVar21,auVar77);
        uVar62 = vmovmskps_avx(auVar77);
      }
    }
    if (uVar62 != 0) {
      auStack_3b8[uVar68] = uVar62;
      uVar4 = vmovlps_avx(local_308);
      *(undefined8 *)(afStack_208 + uVar68 * 2) = uVar4;
      uVar5 = vmovlps_avx(local_5b8);
      auStack_58[uVar68] = uVar5;
      uVar68 = (ulong)((int)uVar68 + 1);
    }
    auVar300 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    do {
      if ((int)uVar68 == 0) {
        if (bVar69) {
          return local_5e9;
        }
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar76._4_4_ = uVar3;
        auVar76._0_4_ = uVar3;
        auVar76._8_4_ = uVar3;
        auVar76._12_4_ = uVar3;
        auVar92 = vcmpps_avx(local_318,auVar76,2);
        uVar61 = vmovmskps_avx(auVar92);
        uVar61 = (uint)uVar67 & uVar61;
        local_5e9 = uVar61 != 0;
        if (!local_5e9) {
          return local_5e9;
        }
        goto LAB_00f10917;
      }
      uVar65 = (int)uVar68 - 1;
      uVar66 = (ulong)uVar65;
      uVar62 = auStack_3b8[uVar66];
      fVar142 = afStack_208[uVar66 * 2];
      fVar166 = afStack_208[uVar66 * 2 + 1];
      local_5b8._8_8_ = 0;
      local_5b8._0_8_ = auStack_58[uVar66];
      uVar5 = 0;
      if (uVar62 != 0) {
        for (; (uVar62 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar62 = uVar62 - 1 & uVar62;
      auStack_3b8[uVar66] = uVar62;
      if (uVar62 == 0) {
        uVar68 = (ulong)uVar65;
      }
      auVar175._8_4_ = 0x3f800000;
      auVar175._0_8_ = &DAT_3f8000003f800000;
      auVar175._12_4_ = 0x3f800000;
      fVar158 = (float)(uVar5 + 1) * 0.14285715;
      fVar139 = (1.0 - (float)uVar5 * 0.14285715) * fVar142 + fVar166 * (float)uVar5 * 0.14285715;
      fVar142 = (1.0 - fVar158) * fVar142 + fVar166 * fVar158;
      fVar166 = fVar142 - fVar139;
      if (0.16666667 <= fVar166) break;
      auVar92 = vshufps_avx(local_5b8,local_5b8,0x50);
      auVar13 = vsubps_avx(auVar175,auVar92);
      fVar158 = auVar92._0_4_;
      fVar140 = auVar92._4_4_;
      fVar186 = auVar92._8_4_;
      fVar163 = auVar92._12_4_;
      fVar185 = auVar13._0_4_;
      fVar161 = auVar13._4_4_;
      fVar141 = auVar13._8_4_;
      fVar187 = auVar13._12_4_;
      auVar126._0_4_ = auVar265._0_4_ * fVar158 + fVar81 * fVar185;
      auVar126._4_4_ = auVar265._4_4_ * fVar140 + fVar103 * fVar161;
      auVar126._8_4_ = auVar265._0_4_ * fVar186 + fVar81 * fVar141;
      auVar126._12_4_ = auVar265._4_4_ * fVar163 + fVar103 * fVar187;
      auVar148._0_4_ = auVar230._0_4_ * fVar158 + fVar82 * fVar185;
      auVar148._4_4_ = auVar230._4_4_ * fVar140 + fVar104 * fVar161;
      auVar148._8_4_ = auVar230._0_4_ * fVar186 + fVar82 * fVar141;
      auVar148._12_4_ = auVar230._4_4_ * fVar163 + fVar104 * fVar187;
      auVar176._0_4_ = auVar213._0_4_ * fVar158 + auVar289._0_4_ * fVar185;
      auVar176._4_4_ = auVar213._4_4_ * fVar140 + auVar289._4_4_ * fVar161;
      auVar176._8_4_ = auVar213._0_4_ * fVar186 + auVar289._0_4_ * fVar141;
      auVar176._12_4_ = auVar213._4_4_ * fVar163 + auVar289._4_4_ * fVar187;
      auVar88._0_4_ = auVar86._0_4_ * fVar158 + fVar185 * (float)local_3e8._0_4_;
      auVar88._4_4_ = auVar86._4_4_ * fVar140 + fVar161 * (float)local_3e8._4_4_;
      auVar88._8_4_ = auVar86._0_4_ * fVar186 + fVar141 * fStack_3e0;
      auVar88._12_4_ = auVar86._4_4_ * fVar163 + fVar187 * fStack_3dc;
      auVar118._16_16_ = auVar126;
      auVar118._0_16_ = auVar126;
      auVar136._16_16_ = auVar148;
      auVar136._0_16_ = auVar148;
      auVar157._16_16_ = auVar176;
      auVar157._0_16_ = auVar176;
      auVar77 = vshufps_avx(ZEXT2032(CONCAT416(fVar142,ZEXT416((uint)fVar139))),
                            ZEXT2032(CONCAT416(fVar142,ZEXT416((uint)fVar139))),0);
      auVar21 = vsubps_avx(auVar136,auVar118);
      fVar158 = auVar77._0_4_;
      fVar185 = auVar77._4_4_;
      fVar140 = auVar77._8_4_;
      fVar161 = auVar77._12_4_;
      fVar186 = auVar77._16_4_;
      fVar141 = auVar77._20_4_;
      fVar163 = auVar77._24_4_;
      auVar119._0_4_ = auVar126._0_4_ + auVar21._0_4_ * fVar158;
      auVar119._4_4_ = auVar126._4_4_ + auVar21._4_4_ * fVar185;
      auVar119._8_4_ = auVar126._8_4_ + auVar21._8_4_ * fVar140;
      auVar119._12_4_ = auVar126._12_4_ + auVar21._12_4_ * fVar161;
      auVar119._16_4_ = auVar126._0_4_ + auVar21._16_4_ * fVar186;
      auVar119._20_4_ = auVar126._4_4_ + auVar21._20_4_ * fVar141;
      auVar119._24_4_ = auVar126._8_4_ + auVar21._24_4_ * fVar163;
      auVar119._28_4_ = auVar126._12_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar157,auVar136);
      auVar137._0_4_ = auVar148._0_4_ + auVar21._0_4_ * fVar158;
      auVar137._4_4_ = auVar148._4_4_ + auVar21._4_4_ * fVar185;
      auVar137._8_4_ = auVar148._8_4_ + auVar21._8_4_ * fVar140;
      auVar137._12_4_ = auVar148._12_4_ + auVar21._12_4_ * fVar161;
      auVar137._16_4_ = auVar148._0_4_ + auVar21._16_4_ * fVar186;
      auVar137._20_4_ = auVar148._4_4_ + auVar21._20_4_ * fVar141;
      auVar137._24_4_ = auVar148._8_4_ + auVar21._24_4_ * fVar163;
      auVar137._28_4_ = auVar148._12_4_ + auVar21._28_4_;
      auVar92 = vsubps_avx(auVar88,auVar176);
      auVar101._0_4_ = auVar176._0_4_ + auVar92._0_4_ * fVar158;
      auVar101._4_4_ = auVar176._4_4_ + auVar92._4_4_ * fVar185;
      auVar101._8_4_ = auVar176._8_4_ + auVar92._8_4_ * fVar140;
      auVar101._12_4_ = auVar176._12_4_ + auVar92._12_4_ * fVar161;
      auVar101._16_4_ = auVar176._0_4_ + auVar92._0_4_ * fVar186;
      auVar101._20_4_ = auVar176._4_4_ + auVar92._4_4_ * fVar141;
      auVar101._24_4_ = auVar176._8_4_ + auVar92._8_4_ * fVar163;
      auVar101._28_4_ = auVar176._12_4_ + auVar92._12_4_;
      auVar21 = vsubps_avx(auVar137,auVar119);
      auVar120._0_4_ = auVar119._0_4_ + fVar158 * auVar21._0_4_;
      auVar120._4_4_ = auVar119._4_4_ + fVar185 * auVar21._4_4_;
      auVar120._8_4_ = auVar119._8_4_ + fVar140 * auVar21._8_4_;
      auVar120._12_4_ = auVar119._12_4_ + fVar161 * auVar21._12_4_;
      auVar120._16_4_ = auVar119._16_4_ + fVar186 * auVar21._16_4_;
      auVar120._20_4_ = auVar119._20_4_ + fVar141 * auVar21._20_4_;
      auVar120._24_4_ = auVar119._24_4_ + fVar163 * auVar21._24_4_;
      auVar120._28_4_ = auVar119._28_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar101,auVar137);
      auVar102._0_4_ = auVar137._0_4_ + fVar158 * auVar21._0_4_;
      auVar102._4_4_ = auVar137._4_4_ + fVar185 * auVar21._4_4_;
      auVar102._8_4_ = auVar137._8_4_ + fVar140 * auVar21._8_4_;
      auVar102._12_4_ = auVar137._12_4_ + fVar161 * auVar21._12_4_;
      auVar102._16_4_ = auVar137._16_4_ + fVar186 * auVar21._16_4_;
      auVar102._20_4_ = auVar137._20_4_ + fVar141 * auVar21._20_4_;
      auVar102._24_4_ = auVar137._24_4_ + fVar163 * auVar21._24_4_;
      auVar102._28_4_ = auVar137._28_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar102,auVar120);
      auVar127._0_4_ = auVar120._0_4_ + fVar158 * auVar21._0_4_;
      auVar127._4_4_ = auVar120._4_4_ + fVar185 * auVar21._4_4_;
      auVar127._8_4_ = auVar120._8_4_ + fVar140 * auVar21._8_4_;
      auVar127._12_4_ = auVar120._12_4_ + fVar161 * auVar21._12_4_;
      auVar138._16_4_ = auVar120._16_4_ + fVar186 * auVar21._16_4_;
      auVar138._0_16_ = auVar127;
      auVar138._20_4_ = auVar120._20_4_ + fVar141 * auVar21._20_4_;
      auVar138._24_4_ = auVar120._24_4_ + fVar163 * auVar21._24_4_;
      auVar138._28_4_ = auVar120._28_4_ + auVar137._28_4_;
      fVar158 = auVar21._4_4_ * 3.0;
      auVar110 = auVar138._16_16_;
      auVar91 = vshufps_avx(ZEXT416((uint)(fVar166 * 0.33333334)),
                            ZEXT416((uint)(fVar166 * 0.33333334)),0);
      auVar231._0_4_ = auVar127._0_4_ + auVar91._0_4_ * auVar21._0_4_ * 3.0;
      auVar231._4_4_ = auVar127._4_4_ + auVar91._4_4_ * fVar158;
      auVar231._8_4_ = auVar127._8_4_ + auVar91._8_4_ * auVar21._8_4_ * 3.0;
      auVar231._12_4_ = auVar127._12_4_ + auVar91._12_4_ * auVar21._12_4_ * 3.0;
      auVar183 = vshufpd_avx(auVar127,auVar127,3);
      auVar72 = vshufpd_avx(auVar110,auVar110,3);
      _local_3d8 = auVar183;
      auVar92 = vsubps_avx(auVar183,auVar127);
      auVar13 = vsubps_avx(auVar72,auVar110);
      auVar89._0_4_ = auVar92._0_4_ + auVar13._0_4_;
      auVar89._4_4_ = auVar92._4_4_ + auVar13._4_4_;
      auVar89._8_4_ = auVar92._8_4_ + auVar13._8_4_;
      auVar89._12_4_ = auVar92._12_4_ + auVar13._12_4_;
      auVar92 = vmovshdup_avx(auVar127);
      auVar13 = vmovshdup_avx(auVar231);
      auVar84 = vshufps_avx(auVar89,auVar89,0);
      auVar74 = vshufps_avx(auVar89,auVar89,0x55);
      fVar141 = auVar74._0_4_;
      fVar163 = auVar74._4_4_;
      fVar187 = auVar74._8_4_;
      fVar121 = auVar74._12_4_;
      fVar185 = auVar84._0_4_;
      fVar140 = auVar84._4_4_;
      fVar161 = auVar84._8_4_;
      fVar186 = auVar84._12_4_;
      auVar214._0_4_ = fVar185 * auVar127._0_4_ + fVar141 * auVar92._0_4_;
      auVar214._4_4_ = fVar140 * auVar127._4_4_ + fVar163 * auVar92._4_4_;
      auVar214._8_4_ = fVar161 * auVar127._8_4_ + fVar187 * auVar92._8_4_;
      auVar214._12_4_ = fVar186 * auVar127._12_4_ + fVar121 * auVar92._12_4_;
      auVar232._0_4_ = auVar231._0_4_ * fVar185 + fVar141 * auVar13._0_4_;
      auVar232._4_4_ = auVar231._4_4_ * fVar140 + fVar163 * auVar13._4_4_;
      auVar232._8_4_ = auVar231._8_4_ * fVar161 + fVar187 * auVar13._8_4_;
      auVar232._12_4_ = auVar231._12_4_ * fVar186 + fVar121 * auVar13._12_4_;
      auVar13 = vshufps_avx(auVar214,auVar214,0xe8);
      auVar84 = vshufps_avx(auVar232,auVar232,0xe8);
      auVar92 = vcmpps_avx(auVar13,auVar84,1);
      uVar62 = vextractps_avx(auVar92,0);
      auVar74 = auVar232;
      if ((uVar62 & 1) == 0) {
        auVar74 = auVar214;
      }
      auVar90._0_4_ = auVar91._0_4_ * auVar21._16_4_ * 3.0;
      auVar90._4_4_ = auVar91._4_4_ * fVar158;
      auVar90._8_4_ = auVar91._8_4_ * auVar21._24_4_ * 3.0;
      auVar90._12_4_ = auVar91._12_4_ * auVar77._28_4_;
      auVar83 = vsubps_avx(auVar110,auVar90);
      auVar91 = vmovshdup_avx(auVar83);
      auVar110 = vmovshdup_avx(auVar110);
      fVar158 = auVar83._0_4_;
      fVar240 = auVar83._4_4_;
      auVar296._0_4_ = fVar185 * fVar158 + fVar141 * auVar91._0_4_;
      auVar296._4_4_ = fVar140 * fVar240 + fVar163 * auVar91._4_4_;
      auVar296._8_4_ = fVar161 * auVar83._8_4_ + fVar187 * auVar91._8_4_;
      auVar296._12_4_ = fVar186 * auVar83._12_4_ + fVar121 * auVar91._12_4_;
      auVar281._0_4_ = fVar185 * auVar138._16_4_ + fVar141 * auVar110._0_4_;
      auVar281._4_4_ = fVar140 * auVar138._20_4_ + fVar163 * auVar110._4_4_;
      auVar281._8_4_ = fVar161 * auVar138._24_4_ + fVar187 * auVar110._8_4_;
      auVar281._12_4_ = fVar186 * auVar138._28_4_ + fVar121 * auVar110._12_4_;
      auVar110 = vshufps_avx(auVar296,auVar296,0xe8);
      auVar105 = vshufps_avx(auVar281,auVar281,0xe8);
      auVar91 = vcmpps_avx(auVar110,auVar105,1);
      uVar62 = vextractps_avx(auVar91,0);
      auVar106 = auVar281;
      if ((uVar62 & 1) == 0) {
        auVar106 = auVar296;
      }
      auVar74 = vmaxss_avx(auVar106,auVar74);
      auVar13 = vminps_avx(auVar13,auVar84);
      auVar84 = vminps_avx(auVar110,auVar105);
      auVar84 = vminps_avx(auVar13,auVar84);
      auVar92 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vblendps_avx(auVar92,auVar91,2);
      auVar91 = vpslld_avx(auVar92,0x1f);
      auVar92 = vshufpd_avx(auVar232,auVar232,1);
      auVar92 = vinsertps_avx(auVar92,auVar281,0x9c);
      auVar13 = vshufpd_avx(auVar214,auVar214,1);
      auVar13 = vinsertps_avx(auVar13,auVar296,0x9c);
      auVar92 = vblendvps_avx(auVar13,auVar92,auVar91);
      auVar13 = vmovshdup_avx(auVar92);
      auVar92 = vmaxss_avx(auVar13,auVar92);
      fVar161 = auVar84._0_4_;
      auVar13 = vmovshdup_avx(auVar84);
      fVar140 = auVar92._0_4_;
      fVar186 = auVar13._0_4_;
      fVar185 = auVar74._0_4_;
      if ((0.0001 <= fVar161) || (fVar140 <= -0.0001)) {
        if ((-0.0001 < fVar185 && fVar186 < 0.0001) ||
           ((fVar161 < 0.0001 && -0.0001 < fVar185 || (fVar186 < 0.0001 && -0.0001 < fVar140))))
        goto LAB_00f11c23;
LAB_00f1283b:
        auVar300 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
LAB_00f12844:
        bVar53 = true;
      }
      else {
LAB_00f11c23:
        auVar91 = vcmpps_avx(auVar84,ZEXT416(0) << 0x20,1);
        auVar13 = vcmpss_avx(auVar74,ZEXT416(0),1);
        auVar290._8_4_ = 0x3f800000;
        auVar290._0_8_ = &DAT_3f8000003f800000;
        auVar290._12_4_ = 0x3f800000;
        auVar177._8_4_ = 0xbf800000;
        auVar177._0_8_ = 0xbf800000bf800000;
        auVar177._12_4_ = 0xbf800000;
        auVar13 = vblendvps_avx(auVar290,auVar177,auVar13);
        auVar91 = vblendvps_avx(auVar290,auVar177,auVar91);
        auVar110 = vcmpss_avx(auVar13,auVar91,4);
        auVar110 = vpshufd_avx(ZEXT416(auVar110._0_4_ & 1),0x50);
        auVar110 = vpslld_avx(auVar110,0x1f);
        auVar110 = vpsrad_avx(auVar110,0x1f);
        auVar110 = vpandn_avx(auVar110,_DAT_02020eb0);
        auVar105 = vmovshdup_avx(auVar91);
        fVar141 = auVar105._0_4_;
        if ((auVar91._0_4_ != fVar141) || (NAN(auVar91._0_4_) || NAN(fVar141))) {
          if ((fVar186 != fVar161) || (NAN(fVar186) || NAN(fVar161))) {
            fVar161 = -fVar161 / (fVar186 - fVar161);
            auVar91 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar161) * 0.0 + fVar161)));
          }
          else {
            auVar91 = vcmpss_avx(auVar84,ZEXT416(0),0);
            auVar91 = vpshufd_avx(ZEXT416(auVar91._0_4_ & 1),0x50);
            auVar91 = vpslld_avx(auVar91,0x1f);
            auVar91 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar91);
          }
          auVar105 = vcmpps_avx(auVar110,auVar91,1);
          auVar84 = vblendps_avx(auVar110,auVar91,2);
          auVar91 = vblendps_avx(auVar91,auVar110,2);
          auVar110 = vblendvps_avx(auVar91,auVar84,auVar105);
        }
        auVar92 = vcmpss_avx(auVar92,ZEXT416(0),1);
        auVar111._8_4_ = 0xbf800000;
        auVar111._0_8_ = 0xbf800000bf800000;
        auVar111._12_4_ = 0xbf800000;
        auVar92 = vblendvps_avx(auVar290,auVar111,auVar92);
        fVar161 = auVar92._0_4_;
        if ((auVar13._0_4_ != fVar161) || (NAN(auVar13._0_4_) || NAN(fVar161))) {
          if ((fVar140 != fVar185) || (NAN(fVar140) || NAN(fVar185))) {
            fVar185 = -fVar185 / (fVar140 - fVar185);
            auVar92 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
          }
          else {
            auVar92 = vcmpss_avx(auVar74,ZEXT416(0),0);
            auVar92 = vpshufd_avx(ZEXT416(auVar92._0_4_ & 1),0x50);
            auVar92 = vpslld_avx(auVar92,0x1f);
            auVar92 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar92);
          }
          auVar91 = vcmpps_avx(auVar110,auVar92,1);
          auVar13 = vblendps_avx(auVar110,auVar92,2);
          auVar92 = vblendps_avx(auVar92,auVar110,2);
          auVar110 = vblendvps_avx(auVar92,auVar13,auVar91);
        }
        if ((fVar141 != fVar161) || (NAN(fVar141) || NAN(fVar161))) {
          auVar92 = vcmpps_avx(auVar110,auVar290,1);
          auVar13 = vinsertps_avx(auVar110,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar178._4_12_ = auVar110._4_12_;
          auVar178._0_4_ = 0x3f800000;
          auVar110 = vblendvps_avx(auVar178,auVar13,auVar92);
        }
        auVar92 = vcmpps_avx(auVar110,_DAT_01fec6f0,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar110._4_12_;
        auVar13 = vinsertps_avx(auVar110,ZEXT416(0x3f800000),0x10);
        auVar92 = vblendvps_avx(auVar13,auVar54 << 0x20,auVar92);
        auVar13 = vmovshdup_avx(auVar92);
        bVar53 = true;
        if (auVar92._0_4_ <= auVar13._0_4_) {
          auVar93._0_4_ = auVar92._0_4_ + -0.1;
          auVar93._4_4_ = auVar92._4_4_ + 0.1;
          auVar93._8_4_ = auVar92._8_4_ + 0.0;
          auVar93._12_4_ = auVar92._12_4_ + 0.0;
          auVar91 = vshufpd_avx(auVar231,auVar231,3);
          auVar128._8_8_ = 0x3f80000000000000;
          auVar128._0_8_ = 0x3f80000000000000;
          auVar92 = vcmpps_avx(auVar93,auVar128,1);
          auVar55._12_4_ = 0;
          auVar55._0_12_ = auVar93._4_12_;
          auVar13 = vinsertps_avx(auVar93,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar92 = vblendvps_avx(auVar13,auVar55 << 0x20,auVar92);
          auVar13 = vshufpd_avx(auVar83,auVar83,3);
          auVar84 = vshufps_avx(auVar92,auVar92,0x50);
          auVar74 = vsubps_avx(auVar290,auVar84);
          local_3d8._0_4_ = auVar183._0_4_;
          local_3d8._4_4_ = auVar183._4_4_;
          fStack_3d0 = auVar183._8_4_;
          fStack_3cc = auVar183._12_4_;
          fVar185 = auVar84._0_4_;
          fVar140 = auVar84._4_4_;
          fVar161 = auVar84._8_4_;
          fVar186 = auVar84._12_4_;
          local_508 = auVar72._0_4_;
          fStack_504 = auVar72._4_4_;
          fStack_500 = auVar72._8_4_;
          fStack_4fc = auVar72._12_4_;
          fVar141 = auVar74._0_4_;
          fVar163 = auVar74._4_4_;
          fVar187 = auVar74._8_4_;
          fVar121 = auVar74._12_4_;
          auVar112._0_4_ = fVar185 * (float)local_3d8._0_4_ + fVar141 * auVar127._0_4_;
          auVar112._4_4_ = fVar140 * (float)local_3d8._4_4_ + fVar163 * auVar127._4_4_;
          auVar112._8_4_ = fVar161 * fStack_3d0 + fVar187 * auVar127._0_4_;
          auVar112._12_4_ = fVar186 * fStack_3cc + fVar121 * auVar127._4_4_;
          auVar149._0_4_ = fVar185 * auVar91._0_4_ + fVar141 * auVar231._0_4_;
          auVar149._4_4_ = fVar140 * auVar91._4_4_ + fVar163 * auVar231._4_4_;
          auVar149._8_4_ = fVar161 * auVar91._8_4_ + fVar187 * auVar231._0_4_;
          auVar149._12_4_ = fVar186 * auVar91._12_4_ + fVar121 * auVar231._4_4_;
          auVar206._0_4_ = fVar185 * auVar13._0_4_ + fVar141 * fVar158;
          auVar206._4_4_ = fVar140 * auVar13._4_4_ + fVar163 * fVar240;
          auVar206._8_4_ = fVar161 * auVar13._8_4_ + fVar187 * fVar158;
          auVar206._12_4_ = fVar186 * auVar13._12_4_ + fVar121 * fVar240;
          auVar215._0_4_ = fVar185 * local_508 + fVar141 * auVar138._16_4_;
          auVar215._4_4_ = fVar140 * fStack_504 + fVar163 * auVar138._20_4_;
          auVar215._8_4_ = fVar161 * fStack_500 + fVar187 * auVar138._16_4_;
          auVar215._12_4_ = fVar186 * fStack_4fc + fVar121 * auVar138._20_4_;
          auVar72 = vsubps_avx(auVar290,auVar92);
          auVar13 = vmovshdup_avx(local_5b8);
          auVar183 = vmovsldup_avx(local_5b8);
          local_5b8._0_4_ = auVar72._0_4_ * auVar183._0_4_ + auVar13._0_4_ * auVar92._0_4_;
          local_5b8._4_4_ = auVar72._4_4_ * auVar183._4_4_ + auVar13._4_4_ * auVar92._4_4_;
          local_5b8._8_4_ = auVar72._8_4_ * auVar183._8_4_ + auVar13._8_4_ * auVar92._8_4_;
          local_5b8._12_4_ = auVar72._12_4_ * auVar183._12_4_ + auVar13._12_4_ * auVar92._12_4_;
          auVar83 = vmovshdup_avx(local_5b8);
          auVar92 = vsubps_avx(auVar149,auVar112);
          auVar179._0_4_ = auVar92._0_4_ * 3.0;
          auVar179._4_4_ = auVar92._4_4_ * 3.0;
          auVar179._8_4_ = auVar92._8_4_ * 3.0;
          auVar179._12_4_ = auVar92._12_4_ * 3.0;
          auVar92 = vsubps_avx(auVar206,auVar149);
          auVar192._0_4_ = auVar92._0_4_ * 3.0;
          auVar192._4_4_ = auVar92._4_4_ * 3.0;
          auVar192._8_4_ = auVar92._8_4_ * 3.0;
          auVar192._12_4_ = auVar92._12_4_ * 3.0;
          auVar92 = vsubps_avx(auVar215,auVar206);
          auVar233._0_4_ = auVar92._0_4_ * 3.0;
          auVar233._4_4_ = auVar92._4_4_ * 3.0;
          auVar233._8_4_ = auVar92._8_4_ * 3.0;
          auVar233._12_4_ = auVar92._12_4_ * 3.0;
          auVar13 = vminps_avx(auVar192,auVar233);
          auVar92 = vmaxps_avx(auVar192,auVar233);
          auVar13 = vminps_avx(auVar179,auVar13);
          auVar92 = vmaxps_avx(auVar179,auVar92);
          auVar183 = vshufpd_avx(auVar13,auVar13,3);
          auVar72 = vshufpd_avx(auVar92,auVar92,3);
          auVar13 = vminps_avx(auVar13,auVar183);
          auVar92 = vmaxps_avx(auVar92,auVar72);
          auVar183 = vshufps_avx(ZEXT416((uint)(1.0 / fVar166)),ZEXT416((uint)(1.0 / fVar166)),0);
          auVar180._0_4_ = auVar183._0_4_ * auVar13._0_4_;
          auVar180._4_4_ = auVar183._4_4_ * auVar13._4_4_;
          auVar180._8_4_ = auVar183._8_4_ * auVar13._8_4_;
          auVar180._12_4_ = auVar183._12_4_ * auVar13._12_4_;
          auVar193._0_4_ = auVar92._0_4_ * auVar183._0_4_;
          auVar193._4_4_ = auVar92._4_4_ * auVar183._4_4_;
          auVar193._8_4_ = auVar92._8_4_ * auVar183._8_4_;
          auVar193._12_4_ = auVar92._12_4_ * auVar183._12_4_;
          auVar74 = ZEXT416((uint)(1.0 / (auVar83._0_4_ - local_5b8._0_4_)));
          auVar92 = vshufpd_avx(auVar112,auVar112,3);
          auVar13 = vshufpd_avx(auVar149,auVar149,3);
          auVar183 = vshufpd_avx(auVar206,auVar206,3);
          auVar72 = vshufpd_avx(auVar215,auVar215,3);
          auVar92 = vsubps_avx(auVar92,auVar112);
          auVar91 = vsubps_avx(auVar13,auVar149);
          auVar84 = vsubps_avx(auVar183,auVar206);
          auVar72 = vsubps_avx(auVar72,auVar215);
          auVar13 = vminps_avx(auVar92,auVar91);
          auVar92 = vmaxps_avx(auVar92,auVar91);
          auVar183 = vminps_avx(auVar84,auVar72);
          auVar183 = vminps_avx(auVar13,auVar183);
          auVar13 = vmaxps_avx(auVar84,auVar72);
          auVar92 = vmaxps_avx(auVar92,auVar13);
          auVar13 = vshufps_avx(auVar74,auVar74,0);
          auVar243._0_4_ = auVar13._0_4_ * auVar183._0_4_;
          auVar243._4_4_ = auVar13._4_4_ * auVar183._4_4_;
          auVar243._8_4_ = auVar13._8_4_ * auVar183._8_4_;
          auVar243._12_4_ = auVar13._12_4_ * auVar183._12_4_;
          auVar251._0_4_ = auVar13._0_4_ * auVar92._0_4_;
          auVar251._4_4_ = auVar13._4_4_ * auVar92._4_4_;
          auVar251._8_4_ = auVar13._8_4_ * auVar92._8_4_;
          auVar251._12_4_ = auVar13._12_4_ * auVar92._12_4_;
          auVar92 = vmovsldup_avx(local_5b8);
          auVar207._4_12_ = auVar92._4_12_;
          auVar207._0_4_ = fVar139;
          auVar216._4_12_ = local_5b8._4_12_;
          auVar216._0_4_ = fVar142;
          auVar75._0_4_ = (fVar142 + fVar139) * 0.5;
          auVar75._4_4_ = (local_5b8._4_4_ + auVar92._4_4_) * 0.5;
          auVar75._8_4_ = (local_5b8._8_4_ + auVar92._8_4_) * 0.5;
          auVar75._12_4_ = (local_5b8._12_4_ + auVar92._12_4_) * 0.5;
          auVar92 = vshufps_avx(auVar75,auVar75,0);
          fVar158 = auVar92._0_4_;
          fVar185 = auVar92._4_4_;
          fVar140 = auVar92._8_4_;
          fVar161 = auVar92._12_4_;
          local_5a8._0_4_ = auVar14._0_4_;
          local_5a8._4_4_ = auVar14._4_4_;
          fStack_5a0 = auVar14._8_4_;
          fStack_59c = auVar14._12_4_;
          auVar150._0_4_ = fVar158 * (float)local_238._0_4_ + (float)local_5a8._0_4_;
          auVar150._4_4_ = fVar185 * (float)local_238._4_4_ + (float)local_5a8._4_4_;
          auVar150._8_4_ = fVar140 * fStack_230 + fStack_5a0;
          auVar150._12_4_ = fVar161 * fStack_22c + fStack_59c;
          local_528 = auVar15._0_4_;
          fStack_524 = auVar15._4_4_;
          fStack_520 = auVar15._8_4_;
          fStack_51c = auVar15._12_4_;
          auVar234._0_4_ = fVar158 * (float)local_248._0_4_ + local_528;
          auVar234._4_4_ = fVar185 * (float)local_248._4_4_ + fStack_524;
          auVar234._8_4_ = fVar140 * fStack_240 + fStack_520;
          auVar234._12_4_ = fVar161 * fStack_23c + fStack_51c;
          local_538._0_4_ = auVar16._0_4_;
          local_538._4_4_ = auVar16._4_4_;
          fStack_530 = auVar16._8_4_;
          fStack_52c = auVar16._12_4_;
          auVar266._0_4_ = fVar158 * (float)local_258._0_4_ + (float)local_538._0_4_;
          auVar266._4_4_ = fVar185 * (float)local_258._4_4_ + (float)local_538._4_4_;
          auVar266._8_4_ = fVar140 * fStack_250 + fStack_530;
          auVar266._12_4_ = fVar161 * fStack_24c + fStack_52c;
          auVar92 = vsubps_avx(auVar234,auVar150);
          auVar151._0_4_ = auVar92._0_4_ * fVar158 + auVar150._0_4_;
          auVar151._4_4_ = auVar92._4_4_ * fVar185 + auVar150._4_4_;
          auVar151._8_4_ = auVar92._8_4_ * fVar140 + auVar150._8_4_;
          auVar151._12_4_ = auVar92._12_4_ * fVar161 + auVar150._12_4_;
          auVar92 = vsubps_avx(auVar266,auVar234);
          auVar235._0_4_ = auVar234._0_4_ + auVar92._0_4_ * fVar158;
          auVar235._4_4_ = auVar234._4_4_ + auVar92._4_4_ * fVar185;
          auVar235._8_4_ = auVar234._8_4_ + auVar92._8_4_ * fVar140;
          auVar235._12_4_ = auVar234._12_4_ + auVar92._12_4_ * fVar161;
          auVar92 = vsubps_avx(auVar235,auVar151);
          fVar158 = auVar151._0_4_ + auVar92._0_4_ * fVar158;
          fVar185 = auVar151._4_4_ + auVar92._4_4_ * fVar185;
          auVar113._0_8_ = CONCAT44(fVar185,fVar158);
          auVar113._8_4_ = auVar151._8_4_ + auVar92._8_4_ * fVar140;
          auVar113._12_4_ = auVar151._12_4_ + auVar92._12_4_ * fVar161;
          fVar140 = auVar92._0_4_ * 3.0;
          fVar161 = auVar92._4_4_ * 3.0;
          auVar152._0_8_ = CONCAT44(fVar161,fVar140);
          auVar152._8_4_ = auVar92._8_4_ * 3.0;
          auVar152._12_4_ = auVar92._12_4_ * 3.0;
          auVar236._8_8_ = auVar113._0_8_;
          auVar236._0_8_ = auVar113._0_8_;
          auVar92 = vshufpd_avx(auVar113,auVar113,3);
          auVar13 = vshufps_avx(auVar75,auVar75,0x55);
          auVar84 = vsubps_avx(auVar92,auVar236);
          auVar237._0_4_ = auVar13._0_4_ * auVar84._0_4_ + fVar158;
          auVar237._4_4_ = auVar13._4_4_ * auVar84._4_4_ + fVar185;
          auVar237._8_4_ = auVar13._8_4_ * auVar84._8_4_ + fVar158;
          auVar237._12_4_ = auVar13._12_4_ * auVar84._12_4_ + fVar185;
          auVar282._8_8_ = auVar152._0_8_;
          auVar282._0_8_ = auVar152._0_8_;
          auVar92 = vshufpd_avx(auVar152,auVar152,1);
          auVar92 = vsubps_avx(auVar92,auVar282);
          auVar153._0_4_ = fVar140 + auVar13._0_4_ * auVar92._0_4_;
          auVar153._4_4_ = fVar161 + auVar13._4_4_ * auVar92._4_4_;
          auVar153._8_4_ = fVar140 + auVar13._8_4_ * auVar92._8_4_;
          auVar153._12_4_ = fVar161 + auVar13._12_4_ * auVar92._12_4_;
          auVar13 = vmovshdup_avx(auVar153);
          auVar283._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
          auVar283._8_4_ = auVar13._8_4_ ^ 0x80000000;
          auVar283._12_4_ = auVar13._12_4_ ^ 0x80000000;
          auVar183 = vmovshdup_avx(auVar84);
          auVar92 = vunpcklps_avx(auVar183,auVar283);
          auVar72 = vshufps_avx(auVar92,auVar283,4);
          auVar114._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
          auVar114._8_4_ = -auVar84._8_4_;
          auVar114._12_4_ = -auVar84._12_4_;
          auVar92 = vmovlhps_avx(auVar114,auVar153);
          auVar91 = vshufps_avx(auVar92,auVar153,8);
          auVar92 = ZEXT416((uint)(auVar183._0_4_ * auVar153._0_4_ - auVar13._0_4_ * auVar84._0_4_))
          ;
          auVar13 = vshufps_avx(auVar92,auVar92,0);
          auVar92 = vdivps_avx(auVar72,auVar13);
          auVar13 = vdivps_avx(auVar91,auVar13);
          auVar91 = vinsertps_avx(auVar180,auVar243,0x1c);
          auVar84 = vinsertps_avx(auVar193,auVar251,0x1c);
          auVar74 = vinsertps_avx(auVar243,auVar180,0x4c);
          auVar110 = vinsertps_avx(auVar251,auVar193,0x4c);
          auVar183 = vmovsldup_avx(auVar92);
          auVar252._0_4_ = auVar183._0_4_ * auVar91._0_4_;
          auVar252._4_4_ = auVar183._4_4_ * auVar91._4_4_;
          auVar252._8_4_ = auVar183._8_4_ * auVar91._8_4_;
          auVar252._12_4_ = auVar183._12_4_ * auVar91._12_4_;
          auVar244._0_4_ = auVar183._0_4_ * auVar84._0_4_;
          auVar244._4_4_ = auVar183._4_4_ * auVar84._4_4_;
          auVar244._8_4_ = auVar183._8_4_ * auVar84._8_4_;
          auVar244._12_4_ = auVar183._12_4_ * auVar84._12_4_;
          auVar72 = vminps_avx(auVar252,auVar244);
          auVar183 = vmaxps_avx(auVar244,auVar252);
          auVar105 = vmovsldup_avx(auVar13);
          auVar297._0_4_ = auVar105._0_4_ * auVar74._0_4_;
          auVar297._4_4_ = auVar105._4_4_ * auVar74._4_4_;
          auVar297._8_4_ = auVar105._8_4_ * auVar74._8_4_;
          auVar297._12_4_ = auVar105._12_4_ * auVar74._12_4_;
          auVar245._0_4_ = auVar105._0_4_ * auVar110._0_4_;
          auVar245._4_4_ = auVar105._4_4_ * auVar110._4_4_;
          auVar245._8_4_ = auVar105._8_4_ * auVar110._8_4_;
          auVar245._12_4_ = auVar105._12_4_ * auVar110._12_4_;
          auVar105 = vminps_avx(auVar297,auVar245);
          auVar94._0_4_ = auVar72._0_4_ + auVar105._0_4_;
          auVar94._4_4_ = auVar72._4_4_ + auVar105._4_4_;
          auVar94._8_4_ = auVar72._8_4_ + auVar105._8_4_;
          auVar94._12_4_ = auVar72._12_4_ + auVar105._12_4_;
          auVar72 = vmaxps_avx(auVar245,auVar297);
          auVar105 = vsubps_avx(auVar207,auVar75);
          auVar106 = vsubps_avx(auVar216,auVar75);
          auVar217._0_4_ = auVar183._0_4_ + auVar72._0_4_;
          auVar217._4_4_ = auVar183._4_4_ + auVar72._4_4_;
          auVar217._8_4_ = auVar183._8_4_ + auVar72._8_4_;
          auVar217._12_4_ = auVar183._12_4_ + auVar72._12_4_;
          auVar253._8_8_ = 0x3f800000;
          auVar253._0_8_ = 0x3f800000;
          auVar183 = vsubps_avx(auVar253,auVar217);
          auVar72 = vsubps_avx(auVar253,auVar94);
          fVar163 = auVar105._0_4_;
          auVar254._0_4_ = fVar163 * auVar183._0_4_;
          fVar187 = auVar105._4_4_;
          auVar254._4_4_ = fVar187 * auVar183._4_4_;
          fVar121 = auVar105._8_4_;
          auVar254._8_4_ = fVar121 * auVar183._8_4_;
          fVar240 = auVar105._12_4_;
          auVar254._12_4_ = fVar240 * auVar183._12_4_;
          fVar140 = auVar106._0_4_;
          auVar218._0_4_ = auVar183._0_4_ * fVar140;
          fVar161 = auVar106._4_4_;
          auVar218._4_4_ = auVar183._4_4_ * fVar161;
          fVar186 = auVar106._8_4_;
          auVar218._8_4_ = auVar183._8_4_ * fVar186;
          fVar141 = auVar106._12_4_;
          auVar218._12_4_ = auVar183._12_4_ * fVar141;
          auVar291._0_4_ = fVar163 * auVar72._0_4_;
          auVar291._4_4_ = fVar187 * auVar72._4_4_;
          auVar291._8_4_ = fVar121 * auVar72._8_4_;
          auVar291._12_4_ = fVar240 * auVar72._12_4_;
          auVar95._0_4_ = fVar140 * auVar72._0_4_;
          auVar95._4_4_ = fVar161 * auVar72._4_4_;
          auVar95._8_4_ = fVar186 * auVar72._8_4_;
          auVar95._12_4_ = fVar141 * auVar72._12_4_;
          auVar183 = vminps_avx(auVar254,auVar291);
          auVar72 = vminps_avx(auVar218,auVar95);
          auVar105 = vminps_avx(auVar183,auVar72);
          auVar183 = vmaxps_avx(auVar291,auVar254);
          auVar72 = vmaxps_avx(auVar95,auVar218);
          auVar106 = vshufps_avx(auVar75,auVar75,0x54);
          auVar72 = vmaxps_avx(auVar72,auVar183);
          auVar123 = vshufps_avx(auVar237,auVar237,0);
          auVar124 = vshufps_avx(auVar237,auVar237,0x55);
          auVar183 = vhaddps_avx(auVar105,auVar105);
          auVar72 = vhaddps_avx(auVar72,auVar72);
          auVar219._0_4_ = auVar123._0_4_ * auVar92._0_4_ + auVar124._0_4_ * auVar13._0_4_;
          auVar219._4_4_ = auVar123._4_4_ * auVar92._4_4_ + auVar124._4_4_ * auVar13._4_4_;
          auVar219._8_4_ = auVar123._8_4_ * auVar92._8_4_ + auVar124._8_4_ * auVar13._8_4_;
          auVar219._12_4_ = auVar123._12_4_ * auVar92._12_4_ + auVar124._12_4_ * auVar13._12_4_;
          auVar105 = vsubps_avx(auVar106,auVar219);
          fVar158 = auVar105._0_4_ + auVar183._0_4_;
          fVar185 = auVar105._0_4_ + auVar72._0_4_;
          auVar183 = vmaxss_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar158));
          auVar72 = vminss_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar142));
          if (auVar72._0_4_ < auVar183._0_4_) goto LAB_00f1283b;
          auVar183 = vmovshdup_avx(auVar92);
          auVar129._0_4_ = auVar91._0_4_ * auVar183._0_4_;
          auVar129._4_4_ = auVar91._4_4_ * auVar183._4_4_;
          auVar129._8_4_ = auVar91._8_4_ * auVar183._8_4_;
          auVar129._12_4_ = auVar91._12_4_ * auVar183._12_4_;
          auVar96._0_4_ = auVar84._0_4_ * auVar183._0_4_;
          auVar96._4_4_ = auVar84._4_4_ * auVar183._4_4_;
          auVar96._8_4_ = auVar84._8_4_ * auVar183._8_4_;
          auVar96._12_4_ = auVar84._12_4_ * auVar183._12_4_;
          auVar72 = vminps_avx(auVar129,auVar96);
          auVar183 = vmaxps_avx(auVar96,auVar129);
          auVar91 = vmovshdup_avx(auVar13);
          auVar181._0_4_ = auVar91._0_4_ * auVar74._0_4_;
          auVar181._4_4_ = auVar91._4_4_ * auVar74._4_4_;
          auVar181._8_4_ = auVar91._8_4_ * auVar74._8_4_;
          auVar181._12_4_ = auVar91._12_4_ * auVar74._12_4_;
          auVar130._0_4_ = auVar91._0_4_ * auVar110._0_4_;
          auVar130._4_4_ = auVar91._4_4_ * auVar110._4_4_;
          auVar130._8_4_ = auVar91._8_4_ * auVar110._8_4_;
          auVar130._12_4_ = auVar91._12_4_ * auVar110._12_4_;
          auVar91 = vminps_avx(auVar181,auVar130);
          auVar194._0_4_ = auVar72._0_4_ + auVar91._0_4_;
          auVar194._4_4_ = auVar72._4_4_ + auVar91._4_4_;
          auVar194._8_4_ = auVar72._8_4_ + auVar91._8_4_;
          auVar194._12_4_ = auVar72._12_4_ + auVar91._12_4_;
          auVar72 = vmaxps_avx(auVar130,auVar181);
          auVar97._0_4_ = auVar183._0_4_ + auVar72._0_4_;
          auVar97._4_4_ = auVar183._4_4_ + auVar72._4_4_;
          auVar97._8_4_ = auVar183._8_4_ + auVar72._8_4_;
          auVar97._12_4_ = auVar183._12_4_ + auVar72._12_4_;
          auVar183 = vsubps_avx(auVar128,auVar97);
          auVar72 = vsubps_avx(auVar128,auVar194);
          auVar182._0_4_ = fVar163 * auVar183._0_4_;
          auVar182._4_4_ = fVar187 * auVar183._4_4_;
          auVar182._8_4_ = fVar121 * auVar183._8_4_;
          auVar182._12_4_ = fVar240 * auVar183._12_4_;
          auVar195._0_4_ = fVar163 * auVar72._0_4_;
          auVar195._4_4_ = fVar187 * auVar72._4_4_;
          auVar195._8_4_ = fVar121 * auVar72._8_4_;
          auVar195._12_4_ = fVar240 * auVar72._12_4_;
          auVar98._0_4_ = fVar140 * auVar183._0_4_;
          auVar98._4_4_ = fVar161 * auVar183._4_4_;
          auVar98._8_4_ = fVar186 * auVar183._8_4_;
          auVar98._12_4_ = fVar141 * auVar183._12_4_;
          auVar131._0_4_ = fVar140 * auVar72._0_4_;
          auVar131._4_4_ = fVar161 * auVar72._4_4_;
          auVar131._8_4_ = fVar186 * auVar72._8_4_;
          auVar131._12_4_ = fVar141 * auVar72._12_4_;
          auVar183 = vminps_avx(auVar182,auVar195);
          auVar72 = vminps_avx(auVar98,auVar131);
          auVar183 = vminps_avx(auVar183,auVar72);
          auVar72 = vmaxps_avx(auVar195,auVar182);
          auVar91 = vmaxps_avx(auVar131,auVar98);
          auVar183 = vhaddps_avx(auVar183,auVar183);
          auVar72 = vmaxps_avx(auVar91,auVar72);
          auVar72 = vhaddps_avx(auVar72,auVar72);
          auVar91 = vmovshdup_avx(auVar105);
          auVar84 = ZEXT416((uint)(auVar91._0_4_ + auVar183._0_4_));
          auVar183 = vmaxss_avx(local_5b8,auVar84);
          auVar91 = ZEXT416((uint)(auVar91._0_4_ + auVar72._0_4_));
          auVar72 = vminss_avx(auVar91,auVar83);
          auVar298._8_4_ = 0x7fffffff;
          auVar298._0_8_ = 0x7fffffff7fffffff;
          auVar298._12_4_ = 0x7fffffff;
          auVar300 = ZEXT1664(auVar298);
          if (auVar183._0_4_ <= auVar72._0_4_) {
            uVar62 = 0;
            if ((fVar139 < fVar158) && (uVar62 = 0, fVar185 < fVar142)) {
              auVar183 = vcmpps_avx(auVar91,auVar83,1);
              auVar72 = vcmpps_avx(local_5b8,auVar84,1);
              auVar183 = vandps_avx(auVar72,auVar183);
              uVar62 = auVar183._0_4_;
            }
            if (((uint)uVar68 < 4 && 0.001 <= fVar166) && (uVar62 & 1) == 0) {
              bVar53 = false;
            }
            else {
              lVar64 = 200;
              do {
                fVar158 = auVar105._0_4_;
                fVar166 = 1.0 - fVar158;
                auVar183 = ZEXT416((uint)(fVar166 * fVar166 * fVar166));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar72 = ZEXT416((uint)(fVar158 * 3.0 * fVar166 * fVar166));
                auVar72 = vshufps_avx(auVar72,auVar72,0);
                auVar91 = ZEXT416((uint)(fVar166 * fVar158 * fVar158 * 3.0));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar84 = ZEXT416((uint)(fVar158 * fVar158 * fVar158));
                auVar84 = vshufps_avx(auVar84,auVar84,0);
                fVar166 = (float)local_5a8._0_4_ * auVar183._0_4_ +
                          local_528 * auVar72._0_4_ +
                          (float)local_268._0_4_ * auVar84._0_4_ +
                          (float)local_538._0_4_ * auVar91._0_4_;
                fVar158 = (float)local_5a8._4_4_ * auVar183._4_4_ +
                          fStack_524 * auVar72._4_4_ +
                          (float)local_268._4_4_ * auVar84._4_4_ +
                          (float)local_538._4_4_ * auVar91._4_4_;
                auVar99._0_8_ = CONCAT44(fVar158,fVar166);
                auVar99._8_4_ =
                     fStack_5a0 * auVar183._8_4_ +
                     fStack_520 * auVar72._8_4_ +
                     fStack_260 * auVar84._8_4_ + fStack_530 * auVar91._8_4_;
                auVar99._12_4_ =
                     fStack_59c * auVar183._12_4_ +
                     fStack_51c * auVar72._12_4_ +
                     fStack_25c * auVar84._12_4_ + fStack_52c * auVar91._12_4_;
                auVar132._8_8_ = auVar99._0_8_;
                auVar132._0_8_ = auVar99._0_8_;
                auVar72 = vshufpd_avx(auVar99,auVar99,1);
                auVar183 = vmovshdup_avx(auVar105);
                auVar72 = vsubps_avx(auVar72,auVar132);
                auVar100._0_4_ = auVar183._0_4_ * auVar72._0_4_ + fVar166;
                auVar100._4_4_ = auVar183._4_4_ * auVar72._4_4_ + fVar158;
                auVar100._8_4_ = auVar183._8_4_ * auVar72._8_4_ + fVar166;
                auVar100._12_4_ = auVar183._12_4_ * auVar72._12_4_ + fVar158;
                auVar183 = vshufps_avx(auVar100,auVar100,0);
                auVar72 = vshufps_avx(auVar100,auVar100,0x55);
                auVar133._0_4_ = auVar92._0_4_ * auVar183._0_4_ + auVar13._0_4_ * auVar72._0_4_;
                auVar133._4_4_ = auVar92._4_4_ * auVar183._4_4_ + auVar13._4_4_ * auVar72._4_4_;
                auVar133._8_4_ = auVar92._8_4_ * auVar183._8_4_ + auVar13._8_4_ * auVar72._8_4_;
                auVar133._12_4_ = auVar92._12_4_ * auVar183._12_4_ + auVar13._12_4_ * auVar72._12_4_
                ;
                auVar105 = vsubps_avx(auVar105,auVar133);
                auVar183 = vandps_avx(auVar298,auVar100);
                auVar72 = vshufps_avx(auVar183,auVar183,0xf5);
                auVar183 = vmaxss_avx(auVar72,auVar183);
                if (auVar183._0_4_ < (float)local_278._0_4_) {
                  fVar166 = auVar105._0_4_;
                  if ((0.0 <= fVar166) && (fVar166 <= 1.0)) {
                    auVar92 = vmovshdup_avx(auVar105);
                    fVar158 = auVar92._0_4_;
                    if ((0.0 <= fVar158) && (fVar158 <= 1.0)) {
                      auVar92 = vinsertps_avx(ZEXT416((uint)(pLVar70->vx).field_0.m128[2]),
                                              ZEXT416((uint)(pLVar70->vy).field_0.m128[2]),0x1c);
                      auVar110 = vinsertps_avx(auVar92,ZEXT416((uint)(pLVar70->vz).field_0.m128[2]),
                                               0x28);
                      auVar92 = vdpps_avx(auVar110,local_288,0x7f);
                      auVar13 = vdpps_avx(auVar110,local_298,0x7f);
                      auVar183 = vdpps_avx(auVar110,local_2c8,0x7f);
                      auVar72 = vdpps_avx(auVar110,local_2d8,0x7f);
                      auVar91 = vdpps_avx(auVar110,local_2e8,0x7f);
                      auVar84 = vdpps_avx(auVar110,local_2f8,0x7f);
                      fVar141 = 1.0 - fVar158;
                      auVar74 = vdpps_avx(auVar110,local_2a8,0x7f);
                      auVar110 = vdpps_avx(auVar110,local_2b8,0x7f);
                      fVar163 = 1.0 - fVar166;
                      fVar185 = auVar105._4_4_;
                      fVar140 = auVar105._8_4_;
                      fVar161 = auVar105._12_4_;
                      fVar186 = fVar163 * fVar166 * fVar166 * 3.0;
                      auVar184._0_4_ = fVar166 * fVar166 * fVar166;
                      auVar184._4_4_ = fVar185 * fVar185 * fVar185;
                      auVar184._8_4_ = fVar140 * fVar140 * fVar140;
                      auVar184._12_4_ = fVar161 * fVar161 * fVar161;
                      fVar185 = fVar166 * 3.0 * fVar163 * fVar163;
                      fVar140 = fVar163 * fVar163 * fVar163;
                      fVar166 = (fVar141 * auVar92._0_4_ + fVar158 * auVar183._0_4_) * fVar140 +
                                (fVar141 * auVar13._0_4_ + fVar158 * auVar72._0_4_) * fVar185 +
                                fVar186 * (fVar141 * auVar74._0_4_ + fVar158 * auVar91._0_4_) +
                                auVar184._0_4_ *
                                (auVar84._0_4_ * fVar158 + fVar141 * auVar110._0_4_);
                      if ((fVar122 <= fVar166) &&
                         (fVar158 = *(float *)(ray + k * 4 + 0x80), fVar166 <= fVar158)) {
                        pGVar7 = (context->scene->geometries).items[uVar61].ptr;
                        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                          bVar71 = false;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar71 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                ) {
                          local_1a8 = vshufps_avx(auVar105,auVar105,0x55);
                          auVar220._8_4_ = 0x3f800000;
                          auVar220._0_8_ = &DAT_3f8000003f800000;
                          auVar220._12_4_ = 0x3f800000;
                          auVar92 = vsubps_avx(auVar220,local_1a8);
                          fVar161 = local_1a8._0_4_;
                          fVar141 = local_1a8._4_4_;
                          fVar187 = local_1a8._8_4_;
                          fVar121 = local_1a8._12_4_;
                          fVar240 = auVar92._0_4_;
                          fVar241 = auVar92._4_4_;
                          fVar248 = auVar92._8_4_;
                          fVar143 = auVar92._12_4_;
                          auVar238._0_4_ =
                               fVar161 * (float)local_408._0_4_ + fVar240 * (float)local_3f8._0_4_;
                          auVar238._4_4_ =
                               fVar141 * (float)local_408._4_4_ + fVar241 * (float)local_3f8._4_4_;
                          auVar238._8_4_ = fVar187 * fStack_400 + fVar248 * fStack_3f0;
                          auVar238._12_4_ = fVar121 * fStack_3fc + fVar143 * fStack_3ec;
                          auVar246._0_4_ =
                               fVar161 * (float)local_448._0_4_ + fVar240 * (float)local_428._0_4_;
                          auVar246._4_4_ =
                               fVar141 * (float)local_448._4_4_ + fVar241 * (float)local_428._4_4_;
                          auVar246._8_4_ = fVar187 * fStack_440 + fVar248 * fStack_420;
                          auVar246._12_4_ = fVar121 * fStack_43c + fVar143 * fStack_41c;
                          auVar255._0_4_ =
                               fVar161 * (float)local_458._0_4_ + fVar240 * (float)local_438._0_4_;
                          auVar255._4_4_ =
                               fVar141 * (float)local_458._4_4_ + fVar241 * (float)local_438._4_4_;
                          auVar255._8_4_ = fVar187 * fStack_450 + fVar248 * fStack_430;
                          auVar255._12_4_ = fVar121 * fStack_44c + fVar143 * fStack_42c;
                          auVar221._0_4_ =
                               fVar161 * (float)local_578._0_4_ + fVar240 * (float)local_418._0_4_;
                          auVar221._4_4_ =
                               fVar141 * (float)local_578._4_4_ + fVar241 * (float)local_418._4_4_;
                          auVar221._8_4_ = fVar187 * fStack_570 + fVar248 * fStack_410;
                          auVar221._12_4_ = fVar121 * fStack_56c + fVar143 * fStack_40c;
                          auVar72 = vsubps_avx(auVar246,auVar238);
                          auVar91 = vsubps_avx(auVar255,auVar246);
                          auVar84 = vsubps_avx(auVar221,auVar255);
                          local_1b8 = vshufps_avx(auVar105,auVar105,0);
                          fVar161 = local_1b8._0_4_;
                          fVar187 = local_1b8._4_4_;
                          fVar121 = local_1b8._8_4_;
                          fVar241 = local_1b8._12_4_;
                          auVar92 = vshufps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),0);
                          fVar141 = auVar92._0_4_;
                          fVar163 = auVar92._4_4_;
                          fVar240 = auVar92._8_4_;
                          fVar248 = auVar92._12_4_;
                          auVar92 = vshufps_avx(auVar184,auVar184,0);
                          auVar13 = vshufps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),0);
                          auVar183 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
                          auVar154._0_4_ =
                               ((auVar91._0_4_ * fVar141 + auVar84._0_4_ * fVar161) * fVar161 +
                               (auVar72._0_4_ * fVar141 + auVar91._0_4_ * fVar161) * fVar141) * 3.0;
                          auVar154._4_4_ =
                               ((auVar91._4_4_ * fVar163 + auVar84._4_4_ * fVar187) * fVar187 +
                               (auVar72._4_4_ * fVar163 + auVar91._4_4_ * fVar187) * fVar163) * 3.0;
                          auVar154._8_4_ =
                               ((auVar91._8_4_ * fVar240 + auVar84._8_4_ * fVar121) * fVar121 +
                               (auVar72._8_4_ * fVar240 + auVar91._8_4_ * fVar121) * fVar240) * 3.0;
                          auVar154._12_4_ =
                               ((auVar91._12_4_ * fVar248 + auVar84._12_4_ * fVar241) * fVar241 +
                               (auVar72._12_4_ * fVar248 + auVar91._12_4_ * fVar241) * fVar248) *
                               3.0;
                          auVar72 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
                          auVar115._0_4_ =
                               auVar72._0_4_ * (float)local_348._0_4_ +
                               auVar183._0_4_ * (float)local_358._0_4_ +
                               auVar92._0_4_ * (float)local_378._0_4_ +
                               auVar13._0_4_ * (float)local_368._0_4_;
                          auVar115._4_4_ =
                               auVar72._4_4_ * (float)local_348._4_4_ +
                               auVar183._4_4_ * (float)local_358._4_4_ +
                               auVar92._4_4_ * (float)local_378._4_4_ +
                               auVar13._4_4_ * (float)local_368._4_4_;
                          auVar115._8_4_ =
                               auVar72._8_4_ * fStack_340 +
                               auVar183._8_4_ * fStack_350 +
                               auVar92._8_4_ * fStack_370 + auVar13._8_4_ * fStack_360;
                          auVar115._12_4_ =
                               auVar72._12_4_ * fStack_33c +
                               auVar183._12_4_ * fStack_34c +
                               auVar92._12_4_ * fStack_36c + auVar13._12_4_ * fStack_35c;
                          auVar92 = vshufps_avx(auVar154,auVar154,0xc9);
                          auVar134._0_4_ = auVar115._0_4_ * auVar92._0_4_;
                          auVar134._4_4_ = auVar115._4_4_ * auVar92._4_4_;
                          auVar134._8_4_ = auVar115._8_4_ * auVar92._8_4_;
                          auVar134._12_4_ = auVar115._12_4_ * auVar92._12_4_;
                          auVar92 = vshufps_avx(auVar115,auVar115,0xc9);
                          auVar116._0_4_ = auVar154._0_4_ * auVar92._0_4_;
                          auVar116._4_4_ = auVar154._4_4_ * auVar92._4_4_;
                          auVar116._8_4_ = auVar154._8_4_ * auVar92._8_4_;
                          auVar116._12_4_ = auVar154._12_4_ * auVar92._12_4_;
                          auVar13 = vsubps_avx(auVar116,auVar134);
                          auVar92 = vshufps_avx(auVar13,auVar13,0x55);
                          local_1e8[0] = (RTCHitN)auVar92[0];
                          local_1e8[1] = (RTCHitN)auVar92[1];
                          local_1e8[2] = (RTCHitN)auVar92[2];
                          local_1e8[3] = (RTCHitN)auVar92[3];
                          local_1e8[4] = (RTCHitN)auVar92[4];
                          local_1e8[5] = (RTCHitN)auVar92[5];
                          local_1e8[6] = (RTCHitN)auVar92[6];
                          local_1e8[7] = (RTCHitN)auVar92[7];
                          local_1e8[8] = (RTCHitN)auVar92[8];
                          local_1e8[9] = (RTCHitN)auVar92[9];
                          local_1e8[10] = (RTCHitN)auVar92[10];
                          local_1e8[0xb] = (RTCHitN)auVar92[0xb];
                          local_1e8[0xc] = (RTCHitN)auVar92[0xc];
                          local_1e8[0xd] = (RTCHitN)auVar92[0xd];
                          local_1e8[0xe] = (RTCHitN)auVar92[0xe];
                          local_1e8[0xf] = (RTCHitN)auVar92[0xf];
                          local_1d8 = vshufps_avx(auVar13,auVar13,0xaa);
                          local_1c8 = vshufps_avx(auVar13,auVar13,0);
                          local_198 = local_338._0_8_;
                          uStack_190 = local_338._8_8_;
                          local_188 = local_328._0_8_;
                          uStack_180 = local_328._8_8_;
                          vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                          uStack_174 = context->user->instID[0];
                          local_178 = uStack_174;
                          uStack_170 = uStack_174;
                          uStack_16c = uStack_174;
                          uStack_168 = context->user->instPrimID[0];
                          uStack_164 = uStack_168;
                          uStack_160 = uStack_168;
                          uStack_15c = uStack_168;
                          *(float *)(ray + k * 4 + 0x80) = fVar166;
                          local_478 = *local_468;
                          uStack_470 = local_468[1];
                          local_3a8.valid = (int *)&local_478;
                          local_3a8.geometryUserPtr = pGVar7->userPtr;
                          local_3a8.context = context->user;
                          local_3a8.ray = (RTCRayN *)ray;
                          local_3a8.hit = local_1e8;
                          local_3a8.N = 4;
                          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar7->occlusionFilterN)(&local_3a8);
                            auVar300 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar59._8_8_ = uStack_470;
                          auVar59._0_8_ = local_478;
                          if (auVar59 == (undefined1  [16])0x0) {
                            auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar92 = auVar92 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var8 = context->args->filter;
                            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var8)(&local_3a8);
                              auVar300 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar60._8_8_ = uStack_470;
                            auVar60._0_8_ = local_478;
                            auVar13 = vpcmpeqd_avx((undefined1  [16])0x0,auVar60);
                            auVar92 = auVar13 ^ _DAT_01febe20;
                            auVar117._8_4_ = 0xff800000;
                            auVar117._0_8_ = 0xff800000ff800000;
                            auVar117._12_4_ = 0xff800000;
                            auVar13 = vblendvps_avx(auVar117,*(undefined1 (*) [16])
                                                              (local_3a8.ray + 0x80),auVar13);
                            *(undefined1 (*) [16])(local_3a8.ray + 0x80) = auVar13;
                          }
                          auVar92 = vpslld_avx(auVar92,0x1f);
                          iVar63 = vmovmskps_avx(auVar92);
                          if (iVar63 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar158;
                          }
                          bVar71 = (char)iVar63 != '\0';
                        }
                        bVar69 = (bool)(bVar69 | bVar71);
                        pLVar70 = local_460;
                      }
                    }
                  }
                  break;
                }
                lVar64 = lVar64 + -1;
              } while (lVar64 != 0);
            }
            goto LAB_00f1285e;
          }
          goto LAB_00f12844;
        }
        auVar300 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      }
LAB_00f1285e:
    } while (bVar53);
    local_308 = vinsertps_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar142),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }